

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

int __thiscall amrex::EB2::Level::coarsenFromFine(Level *this,Level *fineLevel,bool fill_boundary)

{
  FabArray<amrex::EBCellFlagFab> *this_00;
  MultiFab *this_01;
  Array<MultiFab,_3> *this_02;
  BoxArray *ba;
  MultiFab *pMVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  int *piVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  element_type *peVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  byte bVar16;
  byte bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  byte bVar21;
  byte bVar22;
  double *pdVar23;
  Long LVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  pointer ppVar30;
  pointer ppVar31;
  double *pdVar32;
  Long LVar33;
  Long LVar34;
  Long LVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  double *pdVar42;
  Long LVar43;
  Long LVar44;
  Long LVar45;
  undefined8 uVar46;
  int iVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  int iVar50;
  double *pdVar51;
  Long LVar52;
  undefined8 uVar53;
  int iVar54;
  EBCellFlag *pEVar55;
  Long LVar56;
  undefined8 uVar57;
  int iVar58;
  double *pdVar59;
  Long LVar60;
  Long LVar61;
  undefined8 uVar62;
  int iVar63;
  double *pdVar64;
  Long LVar65;
  Long LVar66;
  undefined8 uVar67;
  int iVar68;
  double *pdVar69;
  Long LVar70;
  Long LVar71;
  undefined8 uVar72;
  int iVar73;
  double *pdVar74;
  Long LVar75;
  Long LVar76;
  Long LVar77;
  undefined8 uVar78;
  int iVar79;
  double *pdVar80;
  Long LVar81;
  Long LVar82;
  Long LVar83;
  undefined8 uVar84;
  int iVar85;
  double *pdVar86;
  Long LVar87;
  Long LVar88;
  Long LVar89;
  undefined8 uVar90;
  int iVar91;
  double *pdVar92;
  Long LVar93;
  Long LVar94;
  undefined8 uVar95;
  int iVar96;
  double *pdVar97;
  Long LVar98;
  Long LVar99;
  undefined8 uVar100;
  int iVar101;
  double *pdVar102;
  Long LVar103;
  Long LVar104;
  undefined8 uVar105;
  int iVar106;
  double *pdVar107;
  Long LVar108;
  Long LVar109;
  Long LVar110;
  undefined8 uVar111;
  int iVar112;
  double *pdVar113;
  Long LVar114;
  Long LVar115;
  Long LVar116;
  undefined8 uVar117;
  int iVar118;
  double *pdVar119;
  Long LVar120;
  Long LVar121;
  undefined8 uVar122;
  int iVar123;
  double *pdVar124;
  Long LVar125;
  Long LVar126;
  Long LVar127;
  undefined8 uVar128;
  int iVar129;
  double *pdVar130;
  Long LVar131;
  Long LVar132;
  undefined8 uVar133;
  int iVar134;
  EBCellFlag *pEVar135;
  Long LVar136;
  Long LVar137;
  undefined8 uVar138;
  int iVar139;
  bool bVar140;
  bool bVar141;
  bool bVar142;
  int i;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  uint uVar149;
  long lVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  double *pdVar156;
  bool bVar157;
  bool bVar158;
  bool bVar159;
  byte bVar160;
  char cVar161;
  int iVar162;
  long lVar163;
  long lVar164;
  bool bVar165;
  bool bVar166;
  bool bVar167;
  char cVar168;
  long lVar169;
  long lVar170;
  bool bVar171;
  char cVar172;
  int iVar173;
  BoxArray *this_03;
  long lVar174;
  int k;
  uint uVar175;
  DistributionMapping *this_04;
  long lVar176;
  long lVar177;
  bool bVar178;
  long lVar179;
  long lVar180;
  long lVar181;
  undefined8 *puVar182;
  long lVar183;
  long lVar184;
  bool bVar185;
  bool bVar186;
  bool bVar187;
  bool bVar188;
  long lVar189;
  long lVar190;
  long lVar191;
  bool bVar192;
  int j;
  long lVar193;
  long lVar194;
  long lVar195;
  long lVar196;
  byte bVar197;
  long lVar198;
  long lVar199;
  long lVar200;
  long lVar201;
  long lVar202;
  char cVar203;
  long lVar204;
  long lVar205;
  bool bVar206;
  bool bVar207;
  int iVar208;
  long lVar209;
  byte bVar210;
  int j_00;
  int iVar211;
  long lVar212;
  long lVar213;
  long lVar214;
  IntVect *v;
  byte bVar215;
  int i_00;
  undefined8 *puVar216;
  long lVar217;
  char cVar218;
  long lVar219;
  undefined8 *puVar220;
  FabArray<amrex::FArrayBox> *this_05;
  pointer ppVar221;
  long lVar222;
  long lVar223;
  long lVar224;
  bool bVar225;
  char cVar226;
  long lVar227;
  long lVar228;
  double dVar229;
  double dVar230;
  undefined1 auVar231 [16];
  double dVar232;
  double dVar233;
  byte bVar234;
  byte bVar235;
  Periodicity PVar236;
  long local_13c8;
  long local_1358;
  long local_1318;
  long local_1300;
  long local_12f0;
  int tile_error;
  Box result;
  long local_1258;
  long local_1230;
  MFIter mfi_2;
  IntVect edge_type;
  undefined4 uStack_111c;
  Vector<int,_std::allocator<int>_> *local_1118;
  int local_1108;
  int iStack_1104;
  int iStack_1100;
  Array4<double> local_10e8;
  Box r;
  undefined8 local_1088;
  int iStack_1080;
  Array4<double> local_1068;
  Box bx_15;
  Box bx_14;
  Box bx_13;
  Box bx_12;
  Box bx_11;
  Box bx_10;
  Box bx;
  undefined8 local_f48;
  int iStack_f40;
  Box local_f1c;
  MFIter mfi;
  int local_db8;
  int local_db4;
  int local_d78;
  int local_d74;
  int local_d38;
  int local_d34;
  int local_cf8;
  int local_cf4;
  int local_cb8;
  int local_cb4;
  int local_c78;
  int local_c74;
  int local_c38;
  int local_c34;
  int local_bf8;
  int local_bf4;
  int local_bb8;
  int local_bb4;
  int local_b78;
  int local_b74;
  int local_b38;
  int local_b34;
  int local_af8;
  int local_af4;
  int local_ab8;
  int local_ab4;
  int local_a78;
  int local_a74;
  int local_a38;
  int local_a34;
  int local_9f8;
  int local_9f4;
  int local_9b8;
  int local_9b4;
  int local_978;
  int local_974;
  int local_938;
  int local_934;
  int local_8f8;
  int local_8f4;
  int local_8b8;
  int local_8b4;
  int local_878;
  int local_874;
  int local_838;
  int local_834;
  int local_7f8;
  int local_7f4;
  int local_7b8;
  int local_7b4;
  long local_788;
  int local_778;
  int local_774;
  Box bx_9;
  Box bx_8;
  Box bx_7;
  Box bx_6;
  Box bx_5;
  Box bx_4;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  undefined8 local_678;
  int iStack_670;
  Array4<double> local_658;
  Box bx_3;
  undefined4 uStack_5fc;
  undefined8 local_5f8;
  int iStack_5f0;
  Box bx_2;
  undefined4 uStack_5bc;
  undefined8 local_5b8;
  int iStack_5b0;
  Box bx_1;
  undefined8 local_578;
  int iStack_570;
  Array4<double> local_550;
  IntVect cell;
  undefined4 uStack_504;
  long local_500;
  undefined8 local_4f0;
  int iStack_4e8;
  undefined1 local_4d0 [28];
  undefined4 uStack_4b4;
  undefined8 local_4b0;
  int iStack_4a8;
  Array4<double> local_490;
  FabArrayBase *local_44c;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  undefined8 uStack_438;
  Array4<const_amrex::EBCellFlag> local_430;
  Array4<const_double> local_3f0;
  Array4<const_double> local_3b0;
  Array4<const_double> local_370;
  Array4<const_double> local_330;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Array4<const_double> local_230;
  Array4<const_double> local_1f0;
  Array4<const_double> local_1b0;
  Array4<const_double> local_170;
  Array4<const_double> local_130;
  Array4<const_double> local_f0;
  Array4<const_double> local_b0;
  Array4<amrex::EBCellFlag> local_70;
  
  ba = &fineLevel->m_covered_grids;
  amrex::coarsen((BoxArray *)&mfi,&fineLevel->m_grids,2);
  this_03 = &this->m_grids;
  BoxArray::operator=(this_03,(BoxArray *)&mfi);
  BoxArray::~BoxArray((BoxArray *)&mfi);
  amrex::coarsen((BoxArray *)&mfi,ba,2);
  BoxArray::operator=(&this->m_covered_grids,(BoxArray *)&mfi);
  BoxArray::~BoxArray((BoxArray *)&mfi);
  this_04 = &this->m_dmap;
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)this_04,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
             &fineLevel->m_dmap);
  bVar140 = BoxArray::coarsenable(&fineLevel->m_grids,2,2);
  if ((bVar140) &&
     ((peVar12 = (fineLevel->m_covered_grids).m_ref.
                 super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      (peVar12->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      *(pointer *)
       ((long)&(peVar12->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8) || (bVar140 = BoxArray::coarsenable(ba,2,2), bVar140))))
  {
    pMVar1 = &this->m_levelset;
    edge_type.vect[0] = 1;
    edge_type.vect[1] = 1;
    edge_type.vect[2] = 1;
    convert((BoxArray *)&mfi,this_03,&edge_type);
    mfi_2.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    mfi_2.fabArray = (FabArrayBase *)0x0;
    mfi_2.tile_size.vect[0] = 0;
    mfi_2.tile_size.vect[1] = 0;
    mfi_2.tile_size.vect[2] = 0;
    mfi_2.flags = '\0';
    mfi_2._29_3_ = 0;
    mfi_2.currentIndex = 0;
    mfi_2.beginIndex = 0;
    local_10e8.p = (double *)&PTR__FabFactory_006d8928;
    bVar21 = 0;
    MultiFab::define(pMVar1,(BoxArray *)&mfi,this_04,1,0,(MFInfo *)&mfi_2,
                     (FabFactory<amrex::FArrayBox> *)&local_10e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi_2.tile_size);
    BoxArray::~BoxArray((BoxArray *)&mfi);
    MFIter::MFIter(&mfi,(FabArrayBase *)pMVar1,true);
    while( true ) {
      if (mfi.endIndex <= mfi.currentIndex) break;
      mfi_2.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
      auVar20._12_4_ = 0;
      auVar20._0_12_ = (undefined1  [12])mfi_2._12_12_;
      mfi_2._8_16_ = auVar20 << 0x20;
      MFIter::tilebox((Box *)&local_10e8,&mfi,(IntVect *)&mfi_2);
      MFIter::tilebox((Box *)&local_1068,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&mfi_2,&pMVar1->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&edge_type,
                 &(fineLevel->m_levelset).super_FabArray<amrex::FArrayBox>,&mfi);
      uVar18 = edge_type.vect._0_8_;
      lVar214 = CONCAT44(uStack_111c,edge_type.vect[2]);
      lVar179 = (long)local_1108;
      lVar212 = (long)iStack_1104;
      lVar180 = (long)iStack_1100;
      lVar181 = (long)local_1068.p._4_4_;
      lVar198 = (long)(int)local_1068.jstride;
      lVar174 = (lVar181 - mfi_2.beginIndex) * (long)mfi_2.fabArray * 8 +
                (lVar198 - mfi_2.endIndex) * mfi_2.tile_size.vect._0_8_ * 8 +
                (long)(int)local_1068.p * 8 + (long)mfi_2.currentIndex * -8 +
                (long)mfi_2.m_fa._M_t.
                      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
      puVar182 = (undefined8 *)
                 ((long)(int)local_1068.p * 0x10 +
                  (lVar198 * 2 - lVar180) * (long)local_1118 * 8 +
                  (lVar181 * 2 - lVar212) * lVar214 * 8 + lVar179 * -8 + edge_type.vect._0_8_);
      lVar219 = lVar214 * 0x10;
      for (; lVar150 = lVar174, lVar193 = lVar181, puVar220 = puVar182,
          lVar198 <= local_1068.kstride._4_4_; lVar198 = lVar198 + 1) {
        for (; lVar193 <= (int)local_1068.kstride; lVar193 = lVar193 + 1) {
          if ((int)local_1068.p <= local_1068.jstride._4_4_) {
            lVar169 = 0;
            puVar216 = puVar220;
            do {
              *(undefined8 *)(lVar150 + lVar169 * 8) = *puVar216;
              lVar169 = lVar169 + 1;
              puVar216 = puVar216 + 2;
            } while ((local_1068.jstride._4_4_ - (int)local_1068.p) + 1 != (int)lVar169);
          }
          lVar150 = lVar150 + (long)mfi_2.fabArray * 8;
          puVar220 = puVar220 + lVar214 * 2;
        }
        lVar174 = lVar174 + mfi_2.tile_size.vect._0_8_ * 8;
        puVar182 = puVar182 + (long)local_1118 * 2;
      }
      lVar169 = (long)(int)local_10e8.p;
      lVar183 = (long)local_10e8.p._4_4_;
      lVar189 = (long)(int)local_10e8.jstride;
      lVar198 = (long)local_10e8.jstride._4_4_;
      iVar173 = (int)local_10e8.p * 2 - local_1108;
      lVar174 = lVar214 * 8;
      lVar193 = (lVar183 * 2 - lVar212) * lVar174;
      lVar199 = lVar169 * 0x10;
      lVar150 = lVar193 + lVar199 + lVar179 * -8 + edge_type.vect._0_8_;
      lVar181 = (long)local_1118 * 8;
      iVar208 = (int)local_10e8.jstride * 2 - iStack_1100;
      iVar162 = iVar208 + 1;
      lVar227 = (lVar189 * 2 - lVar180) * lVar181 + lVar199;
      local_1258 = lVar193 + lVar227 + lVar179 * -8 + edge_type.vect._0_8_;
      lVar199 = lVar199 + lVar179 * -8 + edge_type.vect._0_8_;
      iVar143 = local_10e8.p._4_4_ * 2 - iStack_1104;
      local_1300 = lVar227 + lVar179 * -8 + edge_type.vect._0_8_;
      lVar179 = (long)(int)local_10e8.kstride;
      lVar193 = (long)local_10e8.kstride._4_4_;
      bVar22 = 0;
      for (; iVar208 = iVar208 + 2, lVar189 <= lVar193; lVar189 = lVar189 + 1) {
        local_1358 = lVar150 + iVar162 * lVar181;
        local_1230 = lVar150 + iVar208 * lVar181;
        lVar213 = (lVar189 * 2 - lVar180) * (long)local_1118;
        iVar145 = (int)(lVar189 * 2) - iStack_1100;
        lVar163 = (long)(iVar145 + 2) * (long)local_1118;
        lVar151 = (long)(iVar145 + 1) * (long)local_1118;
        lVar200 = iVar208 * lVar181 + lVar199;
        local_12f0 = local_1258;
        iVar145 = iVar143 + 1;
        iVar144 = iVar143;
        for (lVar227 = lVar183; iVar144 = iVar144 + 2, lVar227 <= lVar179; lVar227 = lVar227 + 1) {
          lVar194 = iVar144 * lVar174;
          lVar2 = uVar18 + (lVar227 * 2 - lVar212) * lVar214 * 8;
          iVar146 = (int)(lVar227 * 2) - iStack_1104;
          lVar3 = uVar18 + (iVar146 + 2) * lVar214 * 8;
          lVar176 = 0;
          for (lVar152 = lVar169; bVar140 = true, lVar152 <= lVar198; lVar152 = lVar152 + 1) {
            dVar230 = *(double *)(local_12f0 + lVar176 * 8);
            lVar164 = (long)(iVar173 + (int)lVar176 + 1);
            lVar153 = lVar2 + lVar164 * 8;
            dVar233 = *(double *)(lVar153 + lVar213 * 8);
            if (((dVar230 < 0.0) || (bVar165 = bVar140, 0.0 <= dVar233)) &&
               (bVar165 = false, 0.0 <= dVar233)) {
              bVar165 = dVar230 < 0.0;
            }
            lVar204 = (long)(iVar173 + (int)lVar176 + 2);
            lVar177 = lVar2 + lVar204 * 8;
            dVar6 = *(double *)(lVar177 + lVar213 * 8);
            if (((dVar233 < 0.0) || (bVar206 = true, 0.0 <= dVar6)) &&
               (bVar206 = false, 0.0 <= dVar6)) {
              bVar206 = dVar233 < 0.0;
            }
            dVar233 = *(double *)(lVar194 + local_1300 + lVar176 * 8);
            lVar164 = lVar3 + lVar164 * 8;
            dVar7 = *(double *)(lVar164 + lVar213 * 8);
            if (((dVar233 < 0.0) || (bVar166 = bVar140, 0.0 <= dVar7)) &&
               (bVar166 = false, 0.0 <= dVar7)) {
              bVar166 = dVar233 < 0.0;
            }
            lVar154 = lVar3 + lVar204 * 8;
            dVar8 = *(double *)(lVar154 + lVar213 * 8);
            if (((dVar7 < 0.0) || (bVar167 = bVar140, 0.0 <= dVar8)) &&
               (bVar167 = false, 0.0 <= dVar8)) {
              bVar167 = dVar7 < 0.0;
            }
            dVar7 = *(double *)(local_1230 + lVar176 * 8);
            dVar9 = *(double *)(lVar153 + lVar163 * 8);
            if (((dVar7 < 0.0) || (bVar185 = bVar140, 0.0 <= dVar9)) &&
               (bVar185 = false, 0.0 <= dVar9)) {
              bVar185 = dVar7 < 0.0;
            }
            dVar10 = *(double *)(lVar177 + lVar163 * 8);
            if (((dVar9 < 0.0) || (bVar186 = true, 0.0 <= dVar10)) &&
               (bVar186 = false, 0.0 <= dVar10)) {
              bVar186 = dVar9 < 0.0;
            }
            dVar9 = *(double *)(lVar200 + lVar194 + lVar176 * 8);
            dVar11 = *(double *)(lVar164 + lVar163 * 8);
            if (((dVar9 < 0.0) || (bVar157 = bVar140, 0.0 <= dVar11)) &&
               (bVar157 = false, 0.0 <= dVar11)) {
              bVar157 = dVar9 < 0.0;
            }
            dVar229 = *(double *)(lVar154 + lVar163 * 8);
            if (((dVar11 < 0.0) || (bVar192 = bVar140, 0.0 <= dVar229)) &&
               (bVar192 = false, 0.0 <= dVar229)) {
              bVar192 = dVar11 < 0.0;
            }
            dVar11 = *(double *)(iVar145 * lVar174 + local_1300 + lVar176 * 8);
            if (((dVar230 < 0.0) || (bVar225 = bVar140, 0.0 <= dVar11)) &&
               (bVar225 = false, 0.0 <= dVar11)) {
              bVar225 = dVar230 < 0.0;
            }
            bVar210 = -(dVar233 < 0.0 && 0.0 <= dVar11);
            bVar197 = dVar11 < 0.0 | bVar210;
            if (dVar233 < 0.0) {
              bVar197 = bVar210;
            }
            lVar153 = uVar18 + (iVar146 + 1) * lVar214 * 8 + lVar204 * 8;
            dVar11 = *(double *)(lVar153 + lVar213 * 8);
            if (((dVar6 < 0.0) || (bVar158 = true, 0.0 <= dVar11)) &&
               (bVar158 = false, 0.0 <= dVar11)) {
              bVar158 = dVar6 < 0.0;
            }
            if (((dVar11 < 0.0) || (bVar159 = true, 0.0 <= dVar8)) &&
               (bVar159 = false, 0.0 <= dVar8)) {
              bVar159 = dVar11 < 0.0;
            }
            dVar11 = *(double *)(lVar200 + iVar145 * lVar174 + lVar176 * 8);
            if (((dVar7 < 0.0) || (bVar187 = bVar140, 0.0 <= dVar11)) &&
               (bVar187 = false, 0.0 <= dVar11)) {
              bVar187 = dVar7 < 0.0;
            }
            bVar160 = -(0.0 <= dVar11 && dVar9 < 0.0);
            bVar210 = dVar11 < 0.0 | bVar160;
            if (dVar9 < 0.0) {
              bVar210 = bVar160;
            }
            dVar11 = *(double *)(lVar153 + lVar163 * 8);
            if (((dVar10 < 0.0) || (bVar141 = bVar140, 0.0 <= dVar11)) &&
               (bVar141 = false, 0.0 <= dVar11)) {
              bVar141 = dVar10 < 0.0;
            }
            if (((dVar11 < 0.0) || (bVar142 = true, 0.0 <= dVar229)) &&
               (bVar142 = false, 0.0 <= dVar229)) {
              bVar142 = dVar11 < 0.0;
            }
            dVar11 = *(double *)(local_1358 + lVar176 * 8);
            if (((dVar230 < 0.0) || (bVar171 = bVar140, 0.0 <= dVar11)) &&
               (bVar171 = false, 0.0 <= dVar11)) {
              bVar171 = dVar230 < 0.0;
            }
            bVar235 = -(dVar7 < 0.0 && 0.0 <= dVar11);
            bVar160 = dVar11 < 0.0 | bVar235;
            if (dVar7 < 0.0) {
              bVar160 = bVar235;
            }
            dVar11 = *(double *)(lVar177 + lVar151 * 8);
            if (((dVar6 < 0.0) || (bVar178 = bVar140, 0.0 <= dVar11)) &&
               (bVar178 = false, 0.0 <= dVar11)) {
              bVar178 = dVar6 < 0.0;
            }
            bVar215 = -(0.0 <= dVar11 && dVar10 < 0.0);
            bVar235 = dVar11 < 0.0 | bVar215;
            if (dVar10 < 0.0) {
              bVar235 = bVar215;
            }
            dVar11 = *(double *)(iVar162 * lVar181 + lVar199 + lVar194 + lVar176 * 8);
            if (((dVar233 < 0.0) || (0.0 <= dVar11)) && (bVar140 = false, 0.0 <= dVar11)) {
              bVar140 = dVar233 < 0.0;
            }
            bVar234 = -(dVar9 < 0.0 && 0.0 <= dVar11);
            bVar215 = dVar11 < 0.0 | bVar234;
            if (dVar9 < 0.0) {
              bVar215 = bVar234;
            }
            dVar11 = *(double *)(lVar154 + lVar151 * 8);
            if (((dVar8 < 0.0) || (bVar207 = true, 0.0 <= dVar11)) &&
               (bVar207 = false, 0.0 <= dVar11)) {
              bVar207 = dVar8 < 0.0;
            }
            if (((dVar11 < 0.0) || (bVar188 = true, 0.0 <= dVar229)) &&
               (bVar188 = false, 0.0 <= dVar229)) {
              bVar188 = dVar11 < 0.0;
            }
            cVar226 = bVar225 + (bVar197 & 1);
            cVar218 = bVar187 + (bVar210 & 1);
            cVar172 = bVar171 + (bVar160 & 1);
            cVar168 = bVar140 + (bVar215 & 1);
            cVar161 = cVar218 + cVar226 + cVar172 + cVar168;
            if (cVar161 == '\0') {
              bVar197 = 0;
              bVar210 = 0;
            }
            else if (cVar161 == '\x02') {
              bVar197 = 1;
              bVar210 = 0;
            }
            else {
              bVar197 = 0;
              bVar210 = 1;
            }
            cVar161 = bVar178 + (bVar235 & 1);
            cVar203 = bVar142 + bVar141 + bVar159 + bVar158 + cVar161 + bVar188 + bVar207;
            bVar160 = 1;
            if (cVar203 == '\0') {
              bVar235 = 0;
            }
            else if (cVar203 == '\x02') {
              bVar235 = 1;
            }
            else {
              bVar235 = 0;
              bVar210 = bVar160;
            }
            cVar161 = cVar172 + bVar206 + bVar165 + bVar186 + bVar185 + cVar161;
            if (cVar161 == '\0') {
              bVar215 = 0;
            }
            else if (cVar161 == '\x02') {
              bVar215 = 1;
            }
            else {
              bVar215 = 0;
              bVar210 = bVar160;
            }
            cVar168 = cVar168 + bVar192 + bVar157 + bVar167 + bVar166 + bVar188 + bVar207;
            if (cVar168 == '\0') {
              bVar234 = 0;
            }
            else if (cVar168 == '\x02') {
              bVar234 = 1;
            }
            else {
              bVar234 = 0;
              bVar210 = bVar160;
            }
            cVar168 = bVar167 + bVar166 + bVar206 + bVar165 + cVar226 + bVar159 + bVar158;
            if (cVar168 == '\0') {
              bVar17 = 0;
            }
            else if (cVar168 == '\x02') {
              bVar17 = 1;
            }
            else {
              bVar17 = 0;
              bVar210 = bVar160;
            }
            cVar168 = bVar192 + bVar157 + bVar186 + bVar185 + cVar218 + bVar142 + bVar141;
            if (cVar168 == '\0') {
              bVar16 = 0;
            }
            else if (cVar168 == '\x02') {
              bVar16 = 1;
            }
            else {
              bVar16 = 0;
              bVar210 = bVar160;
            }
            bVar160 = bVar210;
            if ((((bool)(bVar235 & bVar17 & bVar197 & bVar215 & bVar234 & bVar16)) &&
                (bVar197 = (dVar229 < 0.0) + (dVar9 < 0.0) + (dVar10 < 0.0) +
                           (dVar7 < 0.0) + (dVar8 < 0.0) +
                           (dVar233 < 0.0) + (dVar230 < 0.0) + (dVar6 < 0.0), bVar160 = 1,
                (bVar197 & 0xfb) != 2)) && (bVar160 = bVar210, bVar197 != 4)) {
              Abort_host("amrex::check_mvmc: how did this happen? nopen != 4");
              bVar160 = 1;
            }
            if (bVar22 <= bVar160) {
              bVar22 = bVar160;
            }
            lVar176 = lVar176 + 2;
          }
          local_1358 = local_1358 + lVar219;
          local_1230 = local_1230 + lVar219;
          local_12f0 = local_12f0 + lVar219;
          iVar145 = iVar145 + 2;
        }
        iVar162 = iVar162 + 2;
        local_1258 = local_1258 + (long)local_1118 * 0x10;
        local_1300 = local_1300 + (long)local_1118 * 0x10;
      }
      if (bVar21 <= bVar22) {
        bVar21 = bVar22;
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = bVar21;
    ParallelDescriptor::ReduceBoolOr((bool *)&mfi);
    if ((byte)mfi.m_fa._M_t.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl == '\0') {
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      mfi.fabArray = (FabArrayBase *)0x0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      mfi_2.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )&PTR__FabFactory_006d9098;
      FabArray<amrex::EBCellFlagFab>::define
                (&this->m_cellflag,this_03,this_04,1,2,(MFInfo *)&mfi,
                 (FabFactory<amrex::EBCellFlagFab> *)&mfi_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      pMVar1 = &this->m_volfrac;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      mfi.fabArray = (FabArrayBase *)0x0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      mfi_2.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )&PTR__FabFactory_006d8928;
      MultiFab::define(pMVar1,this_03,this_04,1,2,(MFInfo *)&mfi,
                       (FabFactory<amrex::FArrayBox> *)&mfi_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      mfi.fabArray = (FabArrayBase *)0x0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      mfi_2.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )&PTR__FabFactory_006d8928;
      MultiFab::define(&this->m_centroid,this_03,this_04,3,2,(MFInfo *)&mfi,
                       (FabFactory<amrex::FArrayBox> *)&mfi_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      mfi.fabArray = (FabArrayBase *)0x0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      mfi_2.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )&PTR__FabFactory_006d8928;
      MultiFab::define(&this->m_bndryarea,this_03,this_04,1,2,(MFInfo *)&mfi,
                       (FabFactory<amrex::FArrayBox> *)&mfi_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      mfi.fabArray = (FabArrayBase *)0x0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      mfi_2.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )&PTR__FabFactory_006d8928;
      MultiFab::define(&this->m_bndrycent,this_03,this_04,3,2,(MFInfo *)&mfi,
                       (FabFactory<amrex::FArrayBox> *)&mfi_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      mfi.fabArray = (FabArrayBase *)0x0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      mfi_2.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )&PTR__FabFactory_006d8928;
      MultiFab::define(&this->m_bndrynorm,this_03,this_04,3,2,(MFInfo *)&mfi,
                       (FabFactory<amrex::FArrayBox> *)&mfi_2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      lVar179 = 0xd48;
      local_13c8 = 0x11c8;
      lVar174 = 0x1648;
      lVar214 = 0;
      while( true ) {
        iVar162 = 1;
        if (lVar179 == 0x11c8) break;
        iVar208 = (int)lVar214;
        if (iVar208 == 1) {
          edge_type.vect[2] = 0;
          edge_type.vect[0] = 0;
          edge_type.vect[1] = 1;
        }
        else if (iVar208 == 0) {
          edge_type.vect[0] = 1;
          edge_type.vect[1] = 0;
          edge_type.vect[2] = 0;
        }
        else {
          edge_type.vect[0] = 0;
          edge_type.vect[1] = 0;
          edge_type.vect[2] = iVar162;
        }
        plVar4 = (long *)((long)(this->m_geom).super_CoordSys.offset + lVar179 + -8);
        convert((BoxArray *)&mfi,this_03,&edge_type);
        mfi_2.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
        mfi_2.tile_size.vect[2] = 0;
        mfi_2.flags = '\0';
        mfi_2._29_3_ = 0;
        mfi_2.currentIndex = 0;
        mfi_2.beginIndex = 0;
        mfi_2.fabArray = (FabArrayBase *)0x0;
        mfi_2.tile_size.vect[0] = 0;
        mfi_2.tile_size.vect[1] = 0;
        local_10e8.p = (double *)&PTR__FabFactory_006d8928;
        (**(code **)(*plVar4 + 0x10))(plVar4,(BoxArray *)&mfi,this_04,1,2,&mfi_2,&local_10e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mfi_2.tile_size);
        BoxArray::~BoxArray((BoxArray *)&mfi);
        if (iVar208 == 1) {
          iVar162 = 0;
          edge_type.vect[0] = 0;
          edge_type.vect[1] = 1;
        }
        else if (iVar208 == 0) {
          edge_type.vect[0] = 1;
          edge_type.vect[1] = 0;
          iVar162 = 0;
        }
        else {
          edge_type.vect[0] = 0;
          edge_type.vect[1] = 0;
        }
        edge_type.vect[2] = iVar162;
        convert((BoxArray *)&mfi,this_03,&edge_type);
        mfi_2.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
        mfi_2.tile_size.vect[2] = 0;
        mfi_2.flags = '\0';
        mfi_2._29_3_ = 0;
        mfi_2.currentIndex = 0;
        mfi_2.beginIndex = 0;
        mfi_2.fabArray = (FabArrayBase *)0x0;
        mfi_2.tile_size.vect[0] = 0;
        mfi_2.tile_size.vect[1] = 0;
        local_10e8.p = (double *)&PTR__FabFactory_006d8928;
        (**(code **)(*(long *)((long)&(this->m_cellflag).super_FabArrayBase.boxarray.m_bat.m_op +
                              lVar179 + 0x2c) + 0x10))
                  ((long)(this->m_geom).super_CoordSys.offset + local_13c8 + -8,(BoxArray *)&mfi,
                   this_04,2,2,&mfi_2,&local_10e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mfi_2.tile_size);
        BoxArray::~BoxArray((BoxArray *)&mfi);
        edge_type.vect[0] = 1;
        edge_type.vect[1] = 1;
        edge_type.vect[2] = 1;
        edge_type.vect[lVar214] = 0;
        convert((BoxArray *)&mfi,this_03,&edge_type);
        mfi_2.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
        mfi_2.tile_size.vect[2] = 0;
        mfi_2.flags = '\0';
        mfi_2._29_3_ = 0;
        mfi_2.currentIndex = 0;
        mfi_2.beginIndex = 0;
        mfi_2.fabArray = (FabArrayBase *)0x0;
        mfi_2.tile_size.vect[0] = 0;
        mfi_2.tile_size.vect[1] = 0;
        local_10e8.p = (double *)&PTR__FabFactory_006d8928;
        (**(code **)(*(long *)((long)&(this->m_bndryarea).super_FabArray<amrex::FArrayBox>.
                                      super_FabArrayBase.boxarray.m_bat.m_op + lVar179 + 0x2cU) +
                    0x10))((long)(this->m_geom).super_CoordSys.offset + lVar174 + -8,
                           (BoxArray *)&mfi,this_04,1,2,&mfi_2,&local_10e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mfi_2.tile_size);
        BoxArray::~BoxArray((BoxArray *)&mfi);
        lVar214 = lVar214 + 1;
        lVar179 = lVar179 + 0x180;
        local_13c8 = local_13c8 + 0x180;
        lVar174 = lVar174 + 0x180;
      }
      this_00 = &fineLevel->m_cellflag;
      this_01 = &fineLevel->m_volfrac;
      this_02 = &fineLevel->m_areafrac;
      if (fill_boundary) {
        PVar236 = Geometry::periodicity(&fineLevel->m_geom);
        local_490.p = PVar236.period.vect._0_8_;
        local_490.jstride._0_4_ = PVar236.period.vect[2];
        FabArray<amrex::EBCellFlagFab>::FillBoundary<amrex::EBCellFlag>
                  (this_00,(Periodicity *)&local_490,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  (&this_01->super_FabArray<amrex::FArrayBox>,(Periodicity *)&local_490,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  (&(fineLevel->m_centroid).super_FabArray<amrex::FArrayBox>,
                   (Periodicity *)&local_490,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  (&(fineLevel->m_bndryarea).super_FabArray<amrex::FArrayBox>,
                   (Periodicity *)&local_490,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  (&(fineLevel->m_bndrycent).super_FabArray<amrex::FArrayBox>,
                   (Periodicity *)&local_490,false);
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  (&(fineLevel->m_bndrynorm).super_FabArray<amrex::FArrayBox>,
                   (Periodicity *)&local_490,false);
        lVar214 = 3;
        this_05 = (FabArray<amrex::FArrayBox> *)this_02;
        while (bVar140 = lVar214 != 0, lVar214 = lVar214 + -1, bVar140) {
          FabArray<amrex::FArrayBox>::FillBoundary<double>(this_05,(Periodicity *)&local_490,false);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    (this_05 + 3,(Periodicity *)&local_490,false);
          FabArray<amrex::FArrayBox>::FillBoundary<double>
                    (this_05 + 6,(Periodicity *)&local_490,false);
          this_05 = this_05 + 1;
        }
        peVar12 = (fineLevel->m_covered_grids).m_ref.
                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar12->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start !=
            *(pointer *)
             ((long)&(peVar12->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data + 8)) {
          Periodicity::shiftIntVect
                    ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_550,
                     (Periodicity *)&local_490);
          isects.
          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          isects.
          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          isects.
          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          MFIter::MFIter(&mfi,(FabArrayBase *)this_01,'\0');
          while (mfi.currentIndex < mfi.endIndex) {
            MFIter::fabbox((Box *)local_4d0,&mfi);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&mfi_2,&this_01->super_FabArray<amrex::FArrayBox>,&mfi);
            FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                      ((Array4<amrex::EBCellFlag> *)&edge_type,this_00,&mfi);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_10e8,(FabArray<amrex::FArrayBox> *)this_02,&mfi);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_1068,
                       &(fineLevel->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,&mfi);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_658,
                       &(fineLevel->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,&mfi);
            LVar24 = local_550.jstride;
            for (v = (IntVect *)local_550.p; v != (IntVect *)LVar24; v = v + 1) {
              r.bigend.vect[1] = local_4d0._16_4_;
              r.bigend.vect[2] = local_4d0._20_4_;
              r.btype.itype = local_4d0._24_4_;
              r.smallend.vect[0] = local_4d0._0_4_;
              r.smallend.vect[1] = local_4d0._4_4_;
              r.smallend.vect[2] = local_4d0._8_4_;
              r.bigend.vect[0] = local_4d0._12_4_;
              Box::operator+=(&r,v);
              BoxArray::intersections(ba,&r,&isects);
              ppVar30 = isects.
                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (ppVar221 = isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppVar221 != ppVar30;
                  ppVar221 = ppVar221 + 1) {
                r.smallend.vect._0_8_ = *(undefined8 *)(ppVar221->second).smallend.vect;
                uVar19 = *(undefined8 *)((ppVar221->second).smallend.vect + 2);
                uVar18 = *(undefined8 *)((ppVar221->second).bigend.vect + 2);
                r.bigend.vect[1] =
                     (int)((ulong)*(undefined8 *)(ppVar221->second).bigend.vect >> 0x20);
                r.bigend.vect[2] = (int)uVar18;
                r.btype.itype = (uint)((ulong)uVar18 >> 0x20);
                r.smallend.vect[2] = (int)uVar19;
                r.bigend.vect[0] = (int)((ulong)uVar19 >> 0x20);
                Box::operator-=(&r,v);
                bx.bigend.vect[1] = r.bigend.vect[1];
                bx.bigend.vect[2] = r.bigend.vect[2];
                bx.btype = r.btype;
                bx.smallend.vect[0] = r.smallend.vect[0];
                bx.smallend.vect[1] = r.smallend.vect[1];
                uVar18 = bx.smallend.vect._0_8_;
                bx.smallend.vect[2] = r.smallend.vect[2];
                bx.bigend.vect[0] = r.bigend.vect[0];
                for (lVar214 = 0; iVar143 = bx.bigend.vect[2], iVar208 = bx.bigend.vect[1],
                    iVar162 = bx.bigend.vect[0], lVar214 != 3; lVar214 = lVar214 + 1) {
                  if ((r.btype.itype >> ((uint)lVar214 & 0x1f) & 1) == 0) {
                    piVar5 = bx.bigend.vect + lVar214;
                    *piVar5 = *piVar5 + 1;
                  }
                }
                bx.btype.itype = 7;
                bx_1.bigend.vect[1] = r.bigend.vect[1];
                bx_1.bigend.vect[2] = r.bigend.vect[2];
                bx_1.btype = r.btype;
                bx_1.smallend.vect[0] = r.smallend.vect[0];
                bx_1.smallend.vect[1] = r.smallend.vect[1];
                bx_1.smallend.vect[2] = r.smallend.vect[2];
                bx_1.bigend.vect[0] = r.bigend.vect[0];
                if ((r.btype.itype & 1) == 0) {
                  bx_1.bigend.vect[0] = r.bigend.vect[0] + 1;
                  bx_1.btype.itype = r.btype.itype | 1;
                }
                bx_2.bigend.vect[1] = r.bigend.vect[1];
                bx_2.bigend.vect[2] = r.bigend.vect[2];
                bx_2.btype = r.btype;
                bx_2.smallend.vect[0] = r.smallend.vect[0];
                bx_2.smallend.vect[1] = r.smallend.vect[1];
                bx_2.smallend.vect[2] = r.smallend.vect[2];
                bx_2.bigend.vect[0] = r.bigend.vect[0];
                if ((r.btype.itype & 2) == 0) {
                  bx_2.bigend.vect[1] = r.bigend.vect[1] + 1;
                  bx_2.btype.itype = r.btype.itype | 2;
                }
                bx_3.bigend.vect[1] = r.bigend.vect[1];
                bx_3.bigend.vect[2] = r.bigend.vect[2];
                bx_3.btype = r.btype;
                bx_3.smallend.vect[0] = r.smallend.vect[0];
                bx_3.smallend.vect[1] = r.smallend.vect[1];
                bx_3.smallend.vect[2] = r.smallend.vect[2];
                bx_3.bigend.vect[0] = r.bigend.vect[0];
                if ((r.btype.itype & 4) == 0) {
                  bx_3.bigend.vect[2] = r.bigend.vect[2] + 1;
                  bx_3.btype.itype = r.btype.itype | 4;
                }
                bx.smallend.vect[0] = r.smallend.vect[0];
                lVar214 = (long)bx.smallend.vect[0];
                bx.smallend.vect[1] = r.smallend.vect[1];
                lVar174 = (long)bx.smallend.vect[1];
                bx.smallend.vect._0_8_ = uVar18;
                for (lVar179 = (long)r.smallend.vect[2]; lVar180 = lVar174, (int)lVar179 <= iVar143;
                    lVar179 = lVar179 + 1) {
                  for (; lVar181 = lVar214, (int)lVar180 <= iVar208; lVar180 = lVar180 + 1) {
                    for (; (int)lVar181 <= iVar162; lVar181 = lVar181 + 1) {
                      cell.vect[0] = (int)lVar181;
                      cell.vect[1] = (int)lVar180;
                      cell.vect[2] = (int)lVar179;
                      bVar140 = Box::contains(&r,&cell);
                      if (bVar140) {
                        *(undefined8 *)
                         ((lVar180 - mfi_2.beginIndex) * (long)mfi_2.fabArray * 8 +
                          (lVar179 - mfi_2.endIndex) * mfi_2.tile_size.vect._0_8_ * 8 +
                          (long)mfi_2.currentIndex * -8 +
                          (long)mfi_2.m_fa._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                         lVar181 * 8) = 0;
                        *(undefined4 *)
                         ((lVar180 - iStack_1104) * CONCAT44(uStack_111c,edge_type.vect[2]) * 4 +
                          (lVar179 - iStack_1100) * (long)local_1118 * 4 + (long)local_1108 * -4 +
                          edge_type.vect._0_8_ + lVar181 * 4) = 0x40003;
                      }
                      bVar140 = Box::contains(&bx_1,&cell);
                      if (bVar140) {
                        local_10e8.p
                        [((lVar179 - local_10e8.begin.z) *
                          CONCAT44(local_10e8.kstride._4_4_,(int)local_10e8.kstride) +
                         (lVar180 - local_10e8.begin.y) *
                         CONCAT44(local_10e8.jstride._4_4_,(int)local_10e8.jstride) + lVar181) -
                         (long)local_10e8.begin.x] = 0.0;
                      }
                      bVar140 = Box::contains(&bx_2,&cell);
                      if (bVar140) {
                        *(undefined8 *)
                         ((lVar180 - local_1068.begin.y) *
                          CONCAT44(local_1068.jstride._4_4_,(int)local_1068.jstride) * 8 +
                          (lVar179 - local_1068.begin.z) *
                          CONCAT44(local_1068.kstride._4_4_,(int)local_1068.kstride) * 8 +
                          (long)local_1068.begin.x * -8 +
                          CONCAT44(local_1068.p._4_4_,(int)local_1068.p) + lVar181 * 8) = 0;
                      }
                      bVar140 = Box::contains(&bx_3,&cell);
                      if (bVar140) {
                        local_658.p
                        [((lVar179 - local_658.begin.z) * local_658.kstride +
                         (lVar180 - local_658.begin.y) * local_658.jstride + lVar181) -
                         (long)local_658.begin.x] = 0.0;
                      }
                    }
                  }
                }
              }
            }
            MFIter::operator++(&mfi);
          }
          MFIter::~MFIter(&mfi);
          std::
          _Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
          ~_Vector_base(&isects.
                         super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       );
          std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base
                    ((_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_550);
        }
      }
      MFIter::MFIter(&mfi_2,(FabArrayBase *)pMVar1,true);
      iVar162 = 0;
      while (mfi_2.currentIndex < mfi_2.endIndex) {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&edge_type,&pMVar1->super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_10e8,&(this->m_centroid).super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_1068,&(this->m_bndryarea).super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_658,&(this->m_bndrycent).super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_4d0,&(this->m_bndrynorm).super_FabArray<amrex::FArrayBox>
                   ,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&r,(FabArray<amrex::FArrayBox> *)&this->m_areafrac,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&bx,
                   &(this->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&bx_1,
                   &(this->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&bx_2,(FabArray<amrex::FArrayBox> *)&this->m_facecent,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&bx_3,
                   &(this->m_facecent)._M_elems[1].super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_550,&(this->m_facecent)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                   &mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&isects,(FabArray<amrex::FArrayBox> *)&this->m_edgecent,&mfi_2)
        ;
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_490,&(this->m_edgecent)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                   &mfi_2);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&cell,
                   &(this->m_edgecent)._M_elems[2].super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::EBCellFlagFab>::array<amrex::EBCellFlagFab,_0>
                  (&local_70,&this->m_cellflag,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_b0,&this_01->super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_f0,&(fineLevel->m_centroid).super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_130,&(fineLevel->m_bndryarea).super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_170,&(fineLevel->m_bndrycent).super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1b0,&(fineLevel->m_bndrynorm).super_FabArray<amrex::FArrayBox>,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1f0,(FabArray<amrex::FArrayBox> *)this_02,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_230,&(fineLevel->m_areafrac)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                   &mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_270,&(fineLevel->m_areafrac)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                   &mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2b0,(FabArray<amrex::FArrayBox> *)&fineLevel->m_facecent,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2f0,&(fineLevel->m_facecent)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                   &mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_330,&(fineLevel->m_facecent)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                   &mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_370,(FabArray<amrex::FArrayBox> *)&fineLevel->m_edgecent,&mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_3b0,&(fineLevel->m_edgecent)._M_elems[1].super_FabArray<amrex::FArrayBox>,
                   &mfi_2);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_3f0,&(fineLevel->m_edgecent)._M_elems[2].super_FabArray<amrex::FArrayBox>,
                   &mfi_2);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_430,this_00,&mfi_2);
        MFIter::validbox((Box *)&local_44c,&mfi_2);
        MFIter::grownnodaltilebox(&local_f1c,&mfi_2,-1,2);
        iVar139 = local_70.begin.z;
        uVar138 = local_70.begin._0_8_;
        LVar137 = local_70.kstride;
        LVar136 = local_70.jstride;
        pEVar135 = local_70.p;
        iVar134 = local_b0.begin.z;
        uVar133 = local_b0.begin._0_8_;
        LVar132 = local_b0.kstride;
        LVar131 = local_b0.jstride;
        pdVar130 = local_b0.p;
        iVar129 = local_f0.begin.z;
        uVar128 = local_f0.begin._0_8_;
        LVar127 = local_f0.nstride;
        LVar126 = local_f0.kstride;
        LVar125 = local_f0.jstride;
        pdVar124 = local_f0.p;
        iVar123 = local_130.begin.z;
        uVar122 = local_130.begin._0_8_;
        LVar121 = local_130.kstride;
        LVar120 = local_130.jstride;
        pdVar119 = local_130.p;
        iVar118 = local_170.begin.z;
        uVar117 = local_170.begin._0_8_;
        LVar116 = local_170.nstride;
        LVar115 = local_170.kstride;
        LVar114 = local_170.jstride;
        pdVar113 = local_170.p;
        iVar112 = local_1b0.begin.z;
        uVar111 = local_1b0.begin._0_8_;
        LVar110 = local_1b0.nstride;
        LVar109 = local_1b0.kstride;
        LVar108 = local_1b0.jstride;
        pdVar107 = local_1b0.p;
        iVar106 = local_1f0.begin.z;
        uVar105 = local_1f0.begin._0_8_;
        LVar104 = local_1f0.kstride;
        LVar103 = local_1f0.jstride;
        pdVar102 = local_1f0.p;
        iVar101 = local_230.begin.z;
        uVar100 = local_230.begin._0_8_;
        LVar99 = local_230.kstride;
        LVar98 = local_230.jstride;
        pdVar97 = local_230.p;
        iVar96 = local_270.begin.z;
        uVar95 = local_270.begin._0_8_;
        LVar94 = local_270.kstride;
        LVar93 = local_270.jstride;
        pdVar92 = local_270.p;
        iVar91 = local_2b0.begin.z;
        uVar90 = local_2b0.begin._0_8_;
        LVar89 = local_2b0.nstride;
        LVar88 = local_2b0.kstride;
        LVar87 = local_2b0.jstride;
        pdVar86 = local_2b0.p;
        iVar85 = local_2f0.begin.z;
        uVar84 = local_2f0.begin._0_8_;
        LVar83 = local_2f0.nstride;
        LVar82 = local_2f0.kstride;
        LVar81 = local_2f0.jstride;
        pdVar80 = local_2f0.p;
        iVar79 = local_330.begin.z;
        uVar78 = local_330.begin._0_8_;
        LVar77 = local_330.nstride;
        LVar76 = local_330.kstride;
        LVar75 = local_330.jstride;
        pdVar74 = local_330.p;
        iVar73 = local_370.begin.z;
        uVar72 = local_370.begin._0_8_;
        LVar71 = local_370.kstride;
        LVar70 = local_370.jstride;
        pdVar69 = local_370.p;
        iVar68 = local_3b0.begin.z;
        uVar67 = local_3b0.begin._0_8_;
        LVar66 = local_3b0.kstride;
        LVar65 = local_3b0.jstride;
        pdVar64 = local_3b0.p;
        iVar63 = local_3f0.begin.z;
        uVar62 = local_3f0.begin._0_8_;
        LVar61 = local_3f0.kstride;
        LVar60 = local_3f0.jstride;
        pdVar59 = local_3f0.p;
        iVar58 = local_430.begin.z;
        uVar57 = local_430.begin._0_8_;
        auVar20 = (undefined1  [16])local_430._16_16_;
        LVar56 = local_430.jstride;
        pEVar55 = local_430.p;
        iVar54 = local_490.begin.z;
        uVar53 = local_490.begin._0_8_;
        LVar52 = local_490.kstride;
        pdVar51 = local_490.p;
        iVar50 = iStack_4a8;
        uVar49 = local_4b0;
        uVar48 = local_4d0._0_8_;
        iVar47 = local_550.begin.z;
        uVar46 = local_550.begin._0_8_;
        LVar45 = local_550.nstride;
        LVar44 = local_550.kstride;
        LVar43 = local_550.jstride;
        pdVar42 = local_550.p;
        uVar41 = bx_1.smallend.vect._0_8_;
        uVar40 = bx_2.smallend.vect._0_8_;
        uVar39 = bx_3.smallend.vect._0_8_;
        iVar38 = local_658.begin.z;
        iVar37 = local_658.begin.y;
        iVar36 = local_658.begin.x;
        LVar35 = local_658.nstride;
        LVar34 = local_658.kstride;
        LVar33 = local_658.jstride;
        pdVar32 = local_658.p;
        ppVar31 = isects.
                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        iVar29 = local_f1c.bigend.vect[2];
        iVar28 = local_f1c.bigend.vect[1];
        iVar27 = local_f1c.bigend.vect[0];
        iVar26 = local_f1c.smallend.vect[0];
        uVar19 = bx.smallend.vect._0_8_;
        iVar25 = local_1068.begin.z;
        iVar146 = local_1068.begin.y;
        iVar144 = local_1068.begin.x;
        uVar18 = r.smallend.vect._0_8_;
        iVar145 = local_10e8.begin.z;
        iVar173 = local_10e8.begin.y;
        iVar143 = local_10e8.begin.x;
        LVar24 = local_10e8.nstride;
        pdVar23 = local_10e8.p;
        tile_error = 0;
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )&tile_error;
        mfi.tile_size.vect[2] = iStack_43c;
        mfi._28_4_ = SUB84(uStack_438,0);
        mfi.currentIndex = SUB84(uStack_438,4);
        mfi.fabArray = local_44c;
        mfi.tile_size.vect[0] = iStack_444;
        mfi.tile_size.vect[1] = iStack_440;
        mfi._52_4_ = uStack_111c;
        mfi.typ.itype = edge_type.vect[2];
        mfi.tile_array =
             (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)CONCAT44(iStack_1104,local_1108);
        mfi.local_tile_index_map._0_4_ = iStack_1100;
        mfi.index_map = local_1118;
        mfi.endIndex = edge_type.vect[0];
        mfi.streams = edge_type.vect[1];
        lVar174 = CONCAT44(local_10e8.jstride._4_4_,(int)local_10e8.jstride);
        lVar179 = CONCAT44(local_10e8.kstride._4_4_,(int)local_10e8.kstride);
        lVar198 = CONCAT44(local_1068.p._4_4_,(int)local_1068.p);
        lVar212 = CONCAT44(local_1068.jstride._4_4_,(int)local_1068.jstride);
        lVar219 = CONCAT44(local_1068.kstride._4_4_,(int)local_1068.kstride);
        lVar3 = CONCAT44(local_4d0._12_4_,local_4d0._8_4_);
        lVar152 = CONCAT44(local_4d0._20_4_,local_4d0._16_4_);
        lVar176 = CONCAT44(uStack_4b4,local_4d0._24_4_);
        lVar180 = CONCAT44(r.bigend.vect[0],r.smallend.vect[2]);
        lVar181 = CONCAT44(r.bigend.vect[2],r.bigend.vect[1]);
        lVar150 = CONCAT44(bx.bigend.vect[0],bx.smallend.vect[2]);
        lVar193 = CONCAT44(bx.bigend.vect[2],bx.bigend.vect[1]);
        lVar163 = CONCAT44(bx_1.bigend.vect[0],bx_1.smallend.vect[2]);
        lVar200 = CONCAT44(bx_1.bigend.vect[2],bx_1.bigend.vect[1]);
        lVar199 = CONCAT44(bx_2.bigend.vect[0],bx_2.smallend.vect[2]);
        lVar227 = CONCAT44(bx_2.bigend.vect[2],bx_2.bigend.vect[1]);
        lVar151 = CONCAT44(uStack_5bc,bx_2.btype.itype);
        lVar169 = CONCAT44(bx_3.bigend.vect[0],bx_3.smallend.vect[2]);
        lVar183 = CONCAT44(bx_3.bigend.vect[2],bx_3.bigend.vect[1]);
        lVar189 = CONCAT44(uStack_5fc,bx_3.btype.itype);
        ppVar30 = isects.
                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar221 = isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar194 = CONCAT44(local_490.jstride._4_4_,(int)local_490.jstride);
        lVar213 = CONCAT44(cell.vect[1],cell.vect[0]);
        lVar2 = CONCAT44(uStack_504,cell.vect[2]);
        lVar153 = (long)local_f1c.smallend.vect[0];
        lVar164 = (long)local_f1c.smallend.vect[1];
        lVar214 = lVar153 * 8;
        iVar208 = local_f1c.smallend.vect[0] * 2;
        for (lVar177 = (long)local_f1c.smallend.vect[2]; k = (int)lVar177, k <= iVar29;
            lVar177 = lVar177 + 1) {
          lVar154 = (long)k;
          iVar13 = (int)(lVar154 * 2);
          iVar147 = iVar13 + 1;
          for (lVar204 = lVar164; j_00 = (int)lVar204, j_00 <= iVar28; lVar204 = lVar204 + 1) {
            lVar155 = (long)j_00;
            iVar14 = (int)(lVar155 * 2);
            iVar148 = iVar14 + 1;
            local_1318 = 0;
            lVar224 = 0;
            for (i_00 = iVar26; i_00 <= iVar27; i_00 = i_00 + 1) {
              result.btype.itype = mfi.currentIndex;
              result.smallend.vect[0] = (int)mfi.fabArray;
              result.smallend.vect[1] = (int)((ulong)mfi.fabArray >> 0x20);
              result.smallend.vect[0] = result.smallend.vect[0] + -2;
              result.smallend.vect[1] = result.smallend.vect[1] + -2;
              result.smallend.vect[2] = mfi.tile_size.vect[0] + -2;
              result.bigend.vect[0] = mfi.tile_size.vect[1] + 2;
              result.bigend.vect[1] = mfi.tile_size.vect[2] + 2;
              result.bigend.vect[2] = mfi._28_4_ + 2;
              bx_4.btype.itype = mfi.currentIndex;
              bx_4.bigend.vect[2] = mfi._28_4_;
              bx_4.smallend.vect._0_8_ = mfi.fabArray;
              bx_4.bigend.vect[0] = mfi.tile_size.vect[1];
              if ((mfi.currentIndex & 1U) == 0) {
                bx_4.bigend.vect[0] = mfi.tile_size.vect[1] + 1;
                bx_4._20_8_ = CONCAT44(mfi.currentIndex,mfi._28_4_) | 0x100000000;
              }
              bx_5.btype.itype = mfi.currentIndex;
              bx_5.bigend.vect[2] = mfi._28_4_;
              bx_5.bigend.vect[1] = mfi.tile_size.vect[2];
              bx_5.smallend.vect._0_8_ = mfi.fabArray;
              if ((mfi.currentIndex & 2U) == 0) {
                bx_5.bigend.vect[1] = mfi.tile_size.vect[2] + 1;
                bx_5._20_8_ = CONCAT44(mfi.currentIndex,mfi._28_4_) | 0x200000000;
              }
              bx_6.btype.itype = mfi.currentIndex;
              bx_6.bigend.vect[2] = mfi._28_4_;
              bx_6.smallend.vect._0_8_ = mfi.fabArray;
              if ((mfi.currentIndex & 4U) == 0) {
                bx_6._20_8_ = CONCAT44(mfi.currentIndex,mfi._28_4_ + 1) | 0x400000000;
              }
              bx_7.btype.itype = mfi.currentIndex;
              bx_7.bigend.vect[2] = result.bigend.vect[2];
              bx_7.smallend.vect[0] = result.smallend.vect[0];
              bx_7.smallend.vect[1] = result.smallend.vect[1];
              bx_7.bigend.vect[0] = result.bigend.vect[0];
              if ((mfi.currentIndex & 1U) == 0) {
                bx_7.bigend.vect[0] = mfi.tile_size.vect[1] + 3;
                bx_7._20_8_ = CONCAT44(mfi.currentIndex,result.bigend.vect[2]) | 0x100000000;
              }
              bx_8.btype.itype = mfi.currentIndex;
              bx_8.bigend.vect[2] = result.bigend.vect[2];
              bx_8.smallend.vect[0] = result.smallend.vect[0];
              bx_8.smallend.vect[1] = result.smallend.vect[1];
              bx_8.bigend.vect[1] = result.bigend.vect[1];
              if ((mfi.currentIndex & 2U) == 0) {
                bx_8.bigend.vect[1] = mfi.tile_size.vect[2] + 3;
                bx_8._20_8_ = CONCAT44(mfi.currentIndex,result.bigend.vect[2]) | 0x200000000;
              }
              bx_9.btype.itype = mfi.currentIndex;
              bx_9.bigend.vect[2] = result.bigend.vect[2];
              bx_9.smallend.vect[0] = result.smallend.vect[0];
              bx_9.smallend.vect[1] = result.smallend.vect[1];
              if ((mfi.currentIndex & 4U) == 0) {
                bx_9._20_8_ = CONCAT44(mfi.currentIndex,mfi._28_4_ + 3) | 0x400000000;
              }
              bx_10.smallend.vect._0_8_ = mfi.fabArray;
              bx_10.bigend.vect[0] = mfi.tile_size.vect[1] - (mfi.currentIndex & 1U);
              bx_10.bigend.vect[1] = mfi.tile_size.vect[2] + (uint)((mfi.currentIndex & 2U) == 0);
              bx_11.smallend.vect._0_8_ = mfi.fabArray;
              bx_11.bigend.vect[0] = mfi.tile_size.vect[1] + (~mfi.currentIndex & 1U);
              bx_11.bigend.vect[1] = mfi.tile_size.vect[2] + ((mfi.currentIndex << 0x1e) >> 0x1f);
              bx_12.smallend.vect._0_8_ = mfi.fabArray;
              bx_12.bigend.vect[0] = mfi.tile_size.vect[1] + (~mfi.currentIndex & 1U);
              bx_12.bigend.vect[1] = mfi.tile_size.vect[2] + (~((uint)mfi.currentIndex >> 1) & 1);
              bx_13.smallend.vect[0] = result.smallend.vect[0];
              bx_13.smallend.vect[1] = result.smallend.vect[1];
              bx_13.bigend.vect[0] = result.bigend.vect[0] - (mfi.currentIndex & 1U);
              bx_13.bigend.vect[1] = result.bigend.vect[1] + (uint)((mfi.currentIndex & 2U) == 0);
              bx_10.btype.itype = 6;
              bx_10.bigend.vect[2] = mfi._28_4_ + (uint)((mfi.currentIndex & 4U) == 0);
              bx_14.smallend.vect[0] = result.smallend.vect[0];
              bx_14.smallend.vect[1] = result.smallend.vect[1];
              bx_14.bigend.vect[0] = result.bigend.vect[0] + (~mfi.currentIndex & 1U);
              bx_14.bigend.vect[1] = result.bigend.vect[1] + ((mfi.currentIndex << 0x1e) >> 0x1f);
              bx_11.btype.itype = 5;
              bx_11.bigend.vect[2] = mfi._28_4_ + (uint)((mfi.currentIndex & 4U) == 0);
              bx_12.btype.itype = 3;
              bx_12.bigend.vect[2] = mfi._28_4_ + ((mfi.currentIndex << 0x1d) >> 0x1f);
              bx_13.btype.itype = 6;
              bx_13.bigend.vect[2] = result.bigend.vect[2] + (uint)((mfi.currentIndex & 4U) == 0);
              bx_14.btype.itype = 5;
              bx_14.bigend.vect[2] = result.bigend.vect[2] + (uint)((mfi.currentIndex & 4U) == 0);
              bx_15.smallend.vect[0] = result.smallend.vect[0];
              bx_15.smallend.vect[1] = result.smallend.vect[1];
              bx_15.bigend.vect[0] = result.bigend.vect[0] + (~mfi.currentIndex & 1U);
              bx_15.bigend.vect[1] = result.bigend.vect[1] + (~((uint)mfi.currentIndex >> 1) & 1);
              bx_15.btype.itype = 3;
              bx_15.bigend.vect[2] = result.bigend.vect[2] + ((mfi.currentIndex << 0x1d) >> 0x1f);
              bx_15.smallend.vect[2] = result.smallend.vect[2];
              bx_14.smallend.vect[2] = result.smallend.vect[2];
              bx_13.smallend.vect[2] = result.smallend.vect[2];
              bx_9.smallend.vect[2] = result.smallend.vect[2];
              bx_9.bigend.vect[0] = result.bigend.vect[0];
              bx_9.bigend.vect[1] = result.bigend.vect[1];
              bx_8.smallend.vect[2] = result.smallend.vect[2];
              bx_8.bigend.vect[0] = result.bigend.vect[0];
              bx_7.smallend.vect[2] = result.smallend.vect[2];
              bx_7.bigend.vect[1] = result.bigend.vect[1];
              bVar140 = Box::contains((Box *)&mfi.fabArray,i_00,j_00,k);
              local_db8 = (int)uVar49;
              local_db4 = SUB84(uVar49,4);
              local_9b8 = (int)uVar105;
              local_9b4 = SUB84(uVar105,4);
              local_978 = (int)uVar100;
              local_974 = SUB84(uVar100,4);
              local_938 = (int)uVar95;
              local_934 = SUB84(uVar95,4);
              iVar15 = (int)lVar224;
              if (!bVar140) {
                bVar140 = Box::contains(&result,i_00,j_00,k);
                uVar175 = 0;
                if (bVar140) {
                  *(undefined8 *)
                   ((lVar204 - mfi.tile_array._4_4_) * mfi._48_8_ * 8 +
                    (lVar177 - (int)mfi.local_tile_index_map) * (long)mfi.index_map * 8 +
                    (long)(int)mfi.tile_array * -8 + mfi._40_8_ + lVar214 + lVar224 * 4) =
                       0x3ff0000000000000;
                  lVar195 = (long)iVar143;
                  lVar170 = (lVar204 - iVar173) * lVar174 * 8 + (lVar177 - iVar145) * lVar179 * 8;
                  *(undefined8 *)((long)pdVar23 + lVar224 * 4 + lVar170 + lVar195 * -8 + lVar214) =
                       0;
                  *(undefined8 *)
                   ((long)pdVar23 + lVar224 * 4 + lVar170 + LVar24 * 8 + lVar195 * -8 + lVar214) = 0
                  ;
                  *(undefined8 *)
                   ((long)pdVar23 + lVar224 * 4 + LVar24 * 0x10 + lVar170 + lVar195 * -8 + lVar214)
                       = 0;
                  *(undefined8 *)
                   ((lVar204 - iVar146) * lVar212 * 8 + (lVar177 - iVar25) * lVar219 * 8 +
                    (long)iVar144 * -8 + lVar198 + lVar214 + lVar224 * 4) = 0;
                  lVar195 = (long)iVar36;
                  lVar170 = (lVar204 - iVar37) * LVar33 * 8 + (lVar177 - iVar38) * LVar34 * 8;
                  *(undefined8 *)((long)pdVar32 + lVar224 * 4 + lVar170 + lVar195 * -8 + lVar214) =
                       0xbff0000000000000;
                  *(undefined8 *)
                   ((long)pdVar32 + lVar224 * 4 + lVar170 + LVar35 * 8 + lVar195 * -8 + lVar214) =
                       0xbff0000000000000;
                  *(undefined8 *)
                   ((long)pdVar32 + lVar224 * 4 + LVar35 * 0x10 + lVar170 + lVar195 * -8 + lVar214)
                       = 0xbff0000000000000;
                  lVar195 = (long)local_db8;
                  lVar170 = (lVar204 - local_db4) * lVar3 * 8 + (lVar177 - iVar50) * lVar152 * 8;
                  *(undefined8 *)(uVar48 + lVar224 * 4 + lVar170 + lVar195 * -8 + lVar214) = 0;
                  *(undefined8 *)
                   (uVar48 + lVar224 * 4 + lVar170 + lVar176 * 8 + lVar195 * -8 + lVar214) = 0;
                  *(undefined8 *)
                   (uVar48 + lVar224 * 4 + lVar176 * 0x10 + lVar170 + lVar195 * -8 + lVar214) = 0;
                }
                goto LAB_004d0482;
              }
              local_778 = (int)uVar57;
              lVar201 = (long)((iVar208 + iVar15) - local_778);
              local_774 = SUB84(uVar57,4);
              lVar170 = (iVar14 - local_774) * LVar56;
              local_788 = auVar20._0_8_;
              lVar195 = (iVar13 - iVar58) * local_788;
              uVar175 = pEVar55[lVar170 + lVar201 + lVar195].flag & 3;
              local_b38 = (int)uVar138;
              local_b34 = SUB84(uVar138,4);
              if (uVar175 == 3) {
                lVar222 = (long)(((iVar208 + iVar15) - local_778) + 1);
                if (((((~pEVar55[lVar170 + lVar222 + lVar195].flag & 3) != 0) ||
                     (lVar190 = LVar56 * (iVar148 - local_774),
                     (~pEVar55[lVar190 + lVar201 + lVar195].flag & 3) != 0)) ||
                    ((~pEVar55[lVar190 + lVar222 + lVar195].flag & 3) != 0)) ||
                   (((local_788 = local_788 * (iVar147 - iVar58),
                     (~pEVar55[lVar170 + lVar201 + local_788].flag & 3) != 0 ||
                     ((~pEVar55[lVar170 + lVar222 + local_788].flag & 3) != 0)) ||
                    (((~pEVar55[lVar190 + lVar201 + local_788].flag & 3) != 0 ||
                     ((~pEVar55[lVar190 + lVar222 + local_788].flag & 3) != 0))))))
                goto LAB_004cf11e;
                *(undefined4 *)
                 ((long)&pEVar135[((lVar177 - iVar139) * LVar137 +
                                  (lVar204 - local_b34) * LVar136 + lVar153) - (long)local_b38].flag
                 + lVar224 * 2) = 0x40003;
                *(undefined8 *)
                 ((lVar204 - mfi.tile_array._4_4_) * mfi._48_8_ * 8 +
                  (lVar177 - (int)mfi.local_tile_index_map) * (long)mfi.index_map * 8 +
                  (long)(int)mfi.tile_array * -8 + mfi._40_8_ + lVar214 + lVar224 * 4) = 0;
LAB_004cef28:
                lVar195 = (long)iVar143;
                lVar170 = (lVar204 - iVar173) * lVar174 * 8 + (lVar177 - iVar145) * lVar179 * 8;
                *(undefined8 *)((long)pdVar23 + lVar224 * 4 + lVar170 + lVar195 * -8 + lVar214) = 0;
                *(undefined8 *)
                 ((long)pdVar23 + lVar224 * 4 + lVar170 + LVar24 * 8 + lVar195 * -8 + lVar214) = 0;
                *(undefined8 *)
                 ((long)pdVar23 + lVar224 * 4 + LVar24 * 0x10 + lVar170 + lVar195 * -8 + lVar214) =
                     0;
                *(undefined8 *)
                 ((lVar204 - iVar146) * lVar212 * 8 + (lVar177 - iVar25) * lVar219 * 8 +
                  (long)iVar144 * -8 + lVar198 + lVar214 + lVar224 * 4) = 0;
                lVar195 = (long)iVar36;
                lVar170 = (lVar204 - iVar37) * LVar33 * 8 + (lVar177 - iVar38) * LVar34 * 8;
                *(undefined8 *)((long)pdVar32 + lVar224 * 4 + lVar170 + lVar195 * -8 + lVar214) =
                     0xbff0000000000000;
                *(undefined8 *)
                 ((long)pdVar32 + lVar224 * 4 + lVar170 + LVar35 * 8 + lVar195 * -8 + lVar214) =
                     0xbff0000000000000;
                *(undefined8 *)
                 ((long)pdVar32 + lVar224 * 4 + LVar35 * 0x10 + lVar170 + lVar195 * -8 + lVar214) =
                     0xbff0000000000000;
                lVar195 = (long)local_db8;
                lVar170 = (lVar204 - local_db4) * lVar3 * 8 + (lVar177 - iVar50) * lVar152 * 8;
                *(undefined8 *)(uVar48 + lVar224 * 4 + lVar170 + lVar195 * -8 + lVar214) = 0;
                *(undefined8 *)
                 (uVar48 + lVar224 * 4 + lVar170 + lVar176 * 8 + lVar195 * -8 + lVar214) = 0;
                *(undefined8 *)
                 (uVar48 + lVar224 * 4 + lVar176 * 0x10 + lVar170 + lVar195 * -8 + lVar214) = 0;
LAB_004d047d:
                uVar175 = 0;
              }
              else {
                if (((uVar175 == 0) &&
                    (lVar222 = (long)(((iVar208 + iVar15) - local_778) + 1),
                    (pEVar55[lVar170 + lVar222 + lVar195].flag & 3) == 0)) &&
                   ((lVar190 = LVar56 * (iVar148 - local_774),
                    (pEVar55[lVar190 + lVar201 + lVar195].flag & 3) == 0 &&
                    (((((pEVar55[lVar190 + lVar222 + lVar195].flag & 3) == 0 &&
                       (local_788 = local_788 * (iVar147 - iVar58),
                       (pEVar55[lVar170 + lVar201 + local_788].flag & 3) == 0)) &&
                      ((pEVar55[lVar170 + lVar222 + local_788].flag & 3) == 0)) &&
                     (((pEVar55[lVar190 + lVar201 + local_788].flag & 3) == 0 &&
                      ((pEVar55[lVar190 + lVar222 + local_788].flag & 3) == 0)))))))) {
                  lVar195 = (lVar177 - iVar139) * LVar137;
                  lVar170 = (lVar204 - local_b34) * LVar136;
                  *(uint *)((long)&pEVar135[(lVar195 + lVar170 + lVar153) - (long)local_b38].flag +
                           lVar224 * 2) =
                       *(uint *)((long)&pEVar135[(lVar195 + lVar170 + lVar153) - (long)local_b38].
                                        flag + lVar224 * 2) & 0xffffffe0 | 4;
                  *(undefined8 *)
                   ((lVar204 - mfi.tile_array._4_4_) * mfi._48_8_ * 8 +
                    (lVar177 - (int)mfi.local_tile_index_map) * (long)mfi.index_map * 8 +
                    (long)(int)mfi.tile_array * -8 + mfi._40_8_ + lVar214 + lVar224 * 4) =
                       0x3ff0000000000000;
                  goto LAB_004cef28;
                }
LAB_004cf11e:
                lVar195 = (lVar177 - iVar139) * LVar137;
                lVar170 = (lVar204 - local_b34) * LVar136;
                *(uint *)((long)&pEVar135[(lVar195 + lVar170 + lVar153) - (long)local_b38].flag +
                         lVar224 * 2) =
                     *(uint *)((long)&pEVar135[(lVar195 + lVar170 + lVar153) - (long)local_b38].flag
                              + lVar224 * 2) & 0xffffffe0 | 5;
                iVar211 = iVar208 + iVar15;
                local_af8 = (int)uVar133;
                lVar195 = (long)(iVar211 - local_af8);
                local_af4 = SUB84(uVar133,4);
                lVar184 = (iVar14 - local_af4) * LVar131;
                lVar196 = (iVar13 - iVar134) * LVar132;
                lVar228 = (long)((iVar211 - local_af8) + 1);
                lVar222 = (iVar148 - local_af4) * LVar131;
                lVar191 = (iVar147 - iVar134) * LVar132;
                dVar230 = (pdVar130[lVar184 + lVar195 + lVar196] +
                           pdVar130[lVar184 + lVar228 + lVar196] +
                           pdVar130[lVar222 + lVar195 + lVar196] +
                           pdVar130[lVar222 + lVar228 + lVar196] +
                           pdVar130[lVar184 + lVar195 + lVar191] +
                           pdVar130[lVar184 + lVar228 + lVar191] +
                           pdVar130[lVar222 + lVar195 + lVar191] +
                          pdVar130[lVar222 + lVar228 + lVar191]) * 0.125;
                *(double *)
                 ((lVar177 - (int)mfi.local_tile_index_map) * (long)mfi.index_map * 8 +
                  (lVar204 - mfi.tile_array._4_4_) * mfi._48_8_ * 8 + (long)(int)mfi.tile_array * -8
                  + mfi._40_8_ + lVar214 + lVar224 * 4) = dVar230;
                local_ab8 = (int)uVar128;
                lVar202 = (long)(iVar211 - local_ab8);
                local_ab4 = SUB84(uVar128,4);
                lVar209 = (iVar14 - local_ab4) * LVar125;
                lVar201 = (iVar13 - iVar129) * LVar126;
                lVar223 = (iVar148 - local_ab4) * LVar125;
                lVar217 = (long)((iVar211 - local_ab8) + 1);
                lVar190 = (iVar147 - iVar129) * LVar126;
                lVar170 = (lVar204 - iVar173) * lVar174 * 8 + (lVar177 - iVar145) * lVar179 * 8;
                dVar230 = (1.0 / dVar230) * 0.125;
                lVar205 = (long)iVar143;
                *(double *)((long)pdVar23 + lVar224 * 4 + lVar170 + lVar205 * -8 + lVar214) =
                     ((pdVar124[lVar223 + lVar217 + lVar190] * 0.5 + 0.25) *
                      pdVar130[lVar222 + lVar228 + lVar191] +
                     (pdVar124[lVar223 + lVar202 + lVar190] * 0.5 + -0.25) *
                     pdVar130[lVar222 + lVar195 + lVar191] +
                     (pdVar124[lVar209 + lVar217 + lVar190] * 0.5 + 0.25) *
                     pdVar130[lVar184 + lVar228 + lVar191] +
                     (pdVar124[lVar209 + lVar202 + lVar190] * 0.5 + -0.25) *
                     pdVar130[lVar184 + lVar195 + lVar191] +
                     (pdVar124[lVar223 + lVar217 + lVar201] * 0.5 + 0.25) *
                     pdVar130[lVar222 + lVar228 + lVar196] +
                     (pdVar124[lVar223 + lVar202 + lVar201] * 0.5 + -0.25) *
                     pdVar130[lVar222 + lVar195 + lVar196] +
                     (pdVar124[lVar209 + lVar202 + lVar201] * 0.5 + -0.25) *
                     pdVar130[lVar184 + lVar195 + lVar196] +
                     (pdVar124[lVar209 + lVar217 + lVar201] * 0.5 + 0.25) *
                     pdVar130[lVar184 + lVar228 + lVar196]) * dVar230;
                *(double *)
                 ((long)pdVar23 + lVar224 * 4 + lVar170 + LVar24 * 8 + lVar205 * -8 + lVar214) =
                     ((pdVar124[lVar223 + lVar217 + lVar190 + LVar127] * 0.5 + 0.25) *
                      pdVar130[lVar222 + lVar228 + lVar191] +
                     (pdVar124[lVar223 + lVar202 + lVar190 + LVar127] * 0.5 + 0.25) *
                     pdVar130[lVar222 + lVar195 + lVar191] +
                     (pdVar124[lVar209 + lVar217 + lVar190 + LVar127] * 0.5 + -0.25) *
                     pdVar130[lVar184 + lVar228 + lVar191] +
                     (pdVar124[lVar209 + lVar202 + lVar190 + LVar127] * 0.5 + -0.25) *
                     pdVar130[lVar184 + lVar195 + lVar191] +
                     (pdVar124[lVar223 + lVar217 + lVar201 + LVar127] * 0.5 + 0.25) *
                     pdVar130[lVar222 + lVar228 + lVar196] +
                     (pdVar124[lVar223 + lVar202 + lVar201 + LVar127] * 0.5 + 0.25) *
                     pdVar130[lVar222 + lVar195 + lVar196] +
                     (pdVar124[lVar209 + lVar202 + lVar201 + LVar127] * 0.5 + -0.25) *
                     pdVar130[lVar184 + lVar195 + lVar196] +
                     (pdVar124[lVar209 + lVar217 + lVar201 + LVar127] * 0.5 + -0.25) *
                     pdVar130[lVar184 + lVar228 + lVar196]) * dVar230;
                *(double *)
                 ((long)pdVar23 + lVar224 * 4 + LVar24 * 0x10 + lVar170 + lVar205 * -8 + lVar214) =
                     ((pdVar124[lVar223 + lVar217 + lVar190 + LVar127 * 2] * 0.5 + 0.25) *
                      pdVar130[lVar222 + lVar228 + lVar191] +
                     (pdVar124[lVar223 + lVar202 + lVar190 + LVar127 * 2] * 0.5 + 0.25) *
                     pdVar130[lVar222 + lVar195 + lVar191] +
                     (pdVar124[lVar209 + lVar217 + lVar190 + LVar127 * 2] * 0.5 + 0.25) *
                     pdVar130[lVar184 + lVar228 + lVar191] +
                     (pdVar124[lVar209 + lVar202 + lVar190 + LVar127 * 2] * 0.5 + 0.25) *
                     pdVar130[lVar184 + lVar195 + lVar191] +
                     (pdVar124[lVar223 + lVar217 + lVar201 + LVar127 * 2] * 0.5 + -0.25) *
                     pdVar130[lVar222 + lVar228 + lVar196] +
                     (pdVar124[lVar223 + lVar202 + lVar201 + LVar127 * 2] * 0.5 + -0.25) *
                     pdVar130[lVar222 + lVar195 + lVar196] +
                     (pdVar124[lVar209 + lVar202 + lVar201 + LVar127 * 2] * 0.5 + -0.25) *
                     pdVar130[lVar184 + lVar195 + lVar196] +
                     (pdVar124[lVar209 + lVar217 + lVar201 + LVar127 * 2] * 0.5 + -0.25) *
                     pdVar130[lVar184 + lVar228 + lVar196]) * dVar230;
                local_a78 = (int)uVar122;
                lVar195 = (long)(iVar211 - local_a78);
                local_a74 = SUB84(uVar122,4);
                lVar184 = (iVar14 - local_a74) * LVar120;
                lVar209 = (iVar13 - iVar123) * LVar121;
                lVar217 = (long)((iVar211 - local_a78) + 1);
                lVar222 = (iVar148 - local_a74) * LVar120;
                lVar201 = (iVar147 - iVar123) * LVar121;
                dVar230 = (pdVar119[lVar184 + lVar195 + lVar209] +
                           pdVar119[lVar184 + lVar217 + lVar209] +
                           pdVar119[lVar222 + lVar195 + lVar209] +
                           pdVar119[lVar222 + lVar217 + lVar209] +
                           pdVar119[lVar184 + lVar195 + lVar201] +
                           pdVar119[lVar184 + lVar217 + lVar201] +
                           pdVar119[lVar222 + lVar195 + lVar201] +
                          pdVar119[lVar222 + lVar217 + lVar201]) * 0.25;
                *(double *)
                 ((lVar204 - iVar146) * lVar212 * 8 + (lVar177 - iVar25) * lVar219 * 8 +
                  (long)iVar144 * -8 + lVar198 + lVar214 + lVar224 * 4) = dVar230;
                local_a38 = (int)uVar117;
                lVar190 = (long)(iVar211 - local_a38);
                local_a34 = SUB84(uVar117,4);
                lVar223 = (iVar14 - local_a34) * LVar114;
                lVar191 = (iVar13 - iVar118) * LVar115;
                lVar228 = (iVar148 - local_a34) * LVar114;
                lVar205 = (long)((iVar211 - local_a38) + 1);
                lVar196 = (iVar147 - iVar118) * LVar115;
                dVar230 = (1.0 / dVar230) * 0.25;
                lVar170 = (lVar204 - iVar37) * LVar33 * 8 + (lVar177 - iVar38) * LVar34 * 8;
                lVar202 = (long)iVar36;
                *(double *)((long)pdVar32 + lVar224 * 4 + lVar170 + lVar202 * -8 + lVar214) =
                     ((pdVar113[lVar228 + lVar205 + lVar196] * 0.5 + 0.25) *
                      pdVar119[lVar222 + lVar217 + lVar201] +
                     (pdVar113[lVar228 + lVar190 + lVar196] * 0.5 + -0.25) *
                     pdVar119[lVar222 + lVar195 + lVar201] +
                     (pdVar113[lVar223 + lVar205 + lVar196] * 0.5 + 0.25) *
                     pdVar119[lVar184 + lVar217 + lVar201] +
                     (pdVar113[lVar223 + lVar190 + lVar196] * 0.5 + -0.25) *
                     pdVar119[lVar184 + lVar195 + lVar201] +
                     (pdVar113[lVar228 + lVar205 + lVar191] * 0.5 + 0.25) *
                     pdVar119[lVar222 + lVar217 + lVar209] +
                     (pdVar113[lVar228 + lVar190 + lVar191] * 0.5 + -0.25) *
                     pdVar119[lVar222 + lVar195 + lVar209] +
                     (pdVar113[lVar223 + lVar190 + lVar191] * 0.5 + -0.25) *
                     pdVar119[lVar184 + lVar195 + lVar209] +
                     (pdVar113[lVar223 + lVar205 + lVar191] * 0.5 + 0.25) *
                     pdVar119[lVar184 + lVar217 + lVar209]) * dVar230;
                *(double *)
                 ((long)pdVar32 + lVar224 * 4 + lVar170 + LVar35 * 8 + lVar202 * -8 + lVar214) =
                     ((pdVar113[lVar228 + lVar205 + lVar196 + LVar116] * 0.5 + 0.25) *
                      pdVar119[lVar222 + lVar217 + lVar201] +
                     (pdVar113[lVar228 + lVar190 + lVar196 + LVar116] * 0.5 + 0.25) *
                     pdVar119[lVar222 + lVar195 + lVar201] +
                     (pdVar113[lVar223 + lVar205 + lVar196 + LVar116] * 0.5 + -0.25) *
                     pdVar119[lVar184 + lVar217 + lVar201] +
                     (pdVar113[lVar223 + lVar190 + lVar196 + LVar116] * 0.5 + -0.25) *
                     pdVar119[lVar184 + lVar195 + lVar201] +
                     (pdVar113[lVar228 + lVar205 + lVar191 + LVar116] * 0.5 + 0.25) *
                     pdVar119[lVar222 + lVar217 + lVar209] +
                     (pdVar113[lVar228 + lVar190 + lVar191 + LVar116] * 0.5 + 0.25) *
                     pdVar119[lVar222 + lVar195 + lVar209] +
                     (pdVar113[lVar223 + lVar190 + lVar191 + LVar116] * 0.5 + -0.25) *
                     pdVar119[lVar184 + lVar195 + lVar209] +
                     (pdVar113[lVar223 + lVar205 + lVar191 + LVar116] * 0.5 + -0.25) *
                     pdVar119[lVar184 + lVar217 + lVar209]) * dVar230;
                *(double *)
                 ((long)pdVar32 + lVar224 * 4 + LVar35 * 0x10 + lVar170 + lVar202 * -8 + lVar214) =
                     ((pdVar113[lVar228 + lVar205 + lVar196 + LVar116 * 2] * 0.5 + 0.25) *
                      pdVar119[lVar222 + lVar217 + lVar201] +
                     (pdVar113[lVar228 + lVar190 + lVar196 + LVar116 * 2] * 0.5 + 0.25) *
                     pdVar119[lVar222 + lVar195 + lVar201] +
                     (pdVar113[lVar223 + lVar205 + lVar196 + LVar116 * 2] * 0.5 + 0.25) *
                     pdVar119[lVar184 + lVar217 + lVar201] +
                     (pdVar113[lVar223 + lVar190 + lVar196 + LVar116 * 2] * 0.5 + 0.25) *
                     pdVar119[lVar184 + lVar195 + lVar201] +
                     (pdVar113[lVar228 + lVar205 + lVar191 + LVar116 * 2] * 0.5 + -0.25) *
                     pdVar119[lVar222 + lVar217 + lVar209] +
                     (pdVar113[lVar228 + lVar190 + lVar191 + LVar116 * 2] * 0.5 + -0.25) *
                     pdVar119[lVar222 + lVar195 + lVar209] +
                     (pdVar113[lVar223 + lVar190 + lVar191 + LVar116 * 2] * 0.5 + -0.25) *
                     pdVar119[lVar184 + lVar195 + lVar209] +
                     (pdVar113[lVar223 + lVar205 + lVar191 + LVar116 * 2] * 0.5 + -0.25) *
                     pdVar119[lVar184 + lVar217 + lVar209]) * dVar230;
                local_9f8 = (int)uVar111;
                lVar170 = (long)(iVar211 - local_9f8);
                local_9f4 = SUB84(uVar111,4);
                lVar202 = (iVar14 - local_9f4) * LVar108;
                lVar196 = (iVar148 - local_9f4) * LVar108;
                lVar190 = (long)((iVar211 - local_9f8) + 1);
                dVar230 = pdVar119[lVar184 + lVar195 + lVar209];
                dVar233 = pdVar119[lVar184 + lVar217 + lVar209];
                dVar6 = pdVar119[lVar222 + lVar195 + lVar209];
                dVar7 = pdVar119[lVar222 + lVar217 + lVar209];
                lVar205 = (iVar13 - iVar112) * LVar109;
                lVar191 = (iVar147 - iVar112) * LVar109;
                dVar8 = pdVar119[lVar184 + lVar195 + lVar201];
                dVar9 = pdVar119[lVar184 + lVar217 + lVar201];
                dVar10 = pdVar119[lVar222 + lVar195 + lVar201];
                dVar11 = pdVar119[lVar222 + lVar217 + lVar201];
                dVar232 = pdVar107[lVar196 + lVar190 + lVar191] * dVar11 +
                          pdVar107[lVar196 + lVar170 + lVar191] * dVar10 +
                          pdVar107[lVar202 + lVar190 + lVar191] * dVar9 +
                          pdVar107[lVar202 + lVar170 + lVar191] * dVar8 +
                          pdVar107[lVar196 + lVar190 + lVar205] * dVar7 +
                          pdVar107[lVar196 + lVar170 + lVar205] * dVar6 +
                          pdVar107[lVar202 + lVar170 + lVar205] * dVar230 +
                          pdVar107[lVar202 + lVar190 + lVar205] * dVar233;
                dVar229 = dVar11 * pdVar107[lVar196 + lVar190 + lVar191 + LVar110 * 2] +
                          dVar10 * pdVar107[lVar196 + lVar170 + lVar191 + LVar110 * 2] +
                          dVar9 * pdVar107[lVar202 + lVar190 + lVar191 + LVar110 * 2] +
                          dVar8 * pdVar107[lVar202 + lVar170 + lVar191 + LVar110 * 2] +
                          dVar7 * pdVar107[lVar196 + lVar190 + lVar205 + LVar110 * 2] +
                          dVar6 * pdVar107[lVar196 + lVar170 + lVar205 + LVar110 * 2] +
                          dVar230 * pdVar107[lVar202 + lVar170 + lVar205 + LVar110 * 2] +
                          pdVar107[lVar202 + lVar190 + lVar205 + LVar110 * 2] * dVar233;
                dVar230 = dVar11 * pdVar107[lVar196 + lVar190 + lVar191 + LVar110] +
                          dVar10 * pdVar107[lVar196 + lVar170 + lVar191 + LVar110] +
                          dVar9 * pdVar107[lVar202 + lVar190 + lVar191 + LVar110] +
                          dVar8 * pdVar107[lVar202 + lVar170 + lVar191 + LVar110] +
                          dVar7 * pdVar107[lVar196 + lVar190 + lVar205 + LVar110] +
                          dVar6 * pdVar107[lVar196 + lVar170 + lVar205 + LVar110] +
                          dVar230 * pdVar107[lVar202 + lVar170 + lVar205 + LVar110] +
                          pdVar107[lVar202 + lVar190 + lVar205 + LVar110] * dVar233;
                dVar233 = 1.0 / SQRT(dVar229 * dVar229 + dVar232 * dVar232 + dVar230 * dVar230 +
                                     1e-30);
                lVar195 = (long)local_db8;
                lVar170 = (lVar204 - local_db4) * lVar3 * 8 + (lVar177 - iVar50) * lVar152 * 8;
                pdVar156 = (double *)(uVar48 + lVar153 * 8);
                *(double *)((long)pdVar156 + lVar224 * 4 + lVar170 + lVar195 * -8) =
                     dVar232 * dVar233;
                *(double *)((long)pdVar156 + lVar224 * 4 + lVar170 + lVar176 * 8 + lVar195 * -8) =
                     dVar230 * dVar233;
                *(double *)((long)pdVar156 + lVar224 * 4 + lVar176 * 0x10 + lVar170 + lVar195 * -8)
                     = dVar233 * dVar229;
                if ((dVar232 == 0.0) &&
                   (((!NAN(dVar232) &&
                     (auVar231._8_8_ = -(ulong)(dVar230 == 0.0),
                     auVar231._0_8_ = -(ulong)(dVar229 == 0.0),
                     uVar149 = movmskpd((int)pdVar156,auVar231), (byte)((byte)uVar149 >> 1) != 0))
                    && (uVar175 = 1, (uVar149 & 1) != 0)))) goto LAB_004d0482;
                lVar195 = (long)((iVar208 + iVar15) - local_9b8);
                lVar170 = (iVar14 - local_9b4) * LVar103;
                lVar201 = (iVar13 - iVar106) * LVar104;
                uVar175 = 0;
                if ((pdVar102[lVar170 + lVar195 + lVar201] != 1.0) ||
                   (NAN(pdVar102[lVar170 + lVar195 + lVar201]))) goto LAB_004d047d;
                lVar222 = (long)(((iVar208 + iVar15) - local_9b8) + 2);
                if ((pdVar102[lVar170 + lVar222 + lVar201] != 1.0) ||
                   (NAN(pdVar102[lVar170 + lVar222 + lVar201]))) goto LAB_004d047d;
                lVar190 = LVar103 * (iVar148 - local_9b4);
                if ((((pdVar102[lVar190 + lVar195 + lVar201] == 1.0) &&
                     (!NAN(pdVar102[lVar190 + lVar195 + lVar201]))) &&
                    (pdVar102[lVar190 + lVar222 + lVar201] == 1.0)) &&
                   (!NAN(pdVar102[lVar190 + lVar222 + lVar201]))) {
                  lVar201 = LVar104 * (iVar147 - iVar106);
                  if (((pdVar102[lVar170 + lVar195 + lVar201] == 1.0) &&
                      (!NAN(pdVar102[lVar170 + lVar195 + lVar201]))) &&
                     ((((pdVar102[lVar170 + lVar222 + lVar201] == 1.0 &&
                        ((!NAN(pdVar102[lVar170 + lVar222 + lVar201]) &&
                         (pdVar102[lVar190 + lVar195 + lVar201] == 1.0)))) &&
                       (!NAN(pdVar102[lVar190 + lVar195 + lVar201]))) &&
                      ((pdVar102[lVar190 + lVar222 + lVar201] == 1.0 &&
                       (!NAN(pdVar102[lVar190 + lVar222 + lVar201]))))))) {
                    lVar195 = (long)((iVar208 + iVar15) - local_978);
                    lVar170 = (iVar14 - local_974) * LVar98;
                    lVar201 = (iVar13 - iVar101) * LVar99;
                    if ((pdVar97[lVar170 + lVar195 + lVar201] == 1.0) &&
                       (!NAN(pdVar97[lVar170 + lVar195 + lVar201]))) {
                      lVar222 = (long)(((iVar208 + iVar15) - local_978) + 1);
                      if ((pdVar97[lVar170 + lVar222 + lVar201] == 1.0) &&
                         (!NAN(pdVar97[lVar170 + lVar222 + lVar201]))) {
                        lVar190 = LVar98 * ((iVar14 + 2) - local_974);
                        if ((pdVar97[lVar190 + lVar195 + lVar201] == 1.0) &&
                           (((!NAN(pdVar97[lVar190 + lVar195 + lVar201]) &&
                             (pdVar97[lVar190 + lVar222 + lVar201] == 1.0)) &&
                            (!NAN(pdVar97[lVar190 + lVar222 + lVar201]))))) {
                          lVar201 = LVar99 * (iVar147 - iVar101);
                          if (((((pdVar97[lVar170 + lVar195 + lVar201] == 1.0) &&
                                (!NAN(pdVar97[lVar170 + lVar195 + lVar201]))) &&
                               ((pdVar97[lVar170 + lVar222 + lVar201] == 1.0 &&
                                ((!NAN(pdVar97[lVar170 + lVar222 + lVar201]) &&
                                 (pdVar97[lVar190 + lVar195 + lVar201] == 1.0)))))) &&
                              (!NAN(pdVar97[lVar190 + lVar195 + lVar201]))) &&
                             ((pdVar97[lVar190 + lVar222 + lVar201] == 1.0 &&
                              (!NAN(pdVar97[lVar190 + lVar222 + lVar201]))))) {
                            lVar195 = (long)((iVar208 + iVar15) - local_938);
                            lVar170 = (iVar14 - local_934) * LVar93;
                            lVar201 = (iVar13 - iVar96) * LVar94;
                            if ((pdVar92[lVar170 + lVar195 + lVar201] == 1.0) &&
                               (!NAN(pdVar92[lVar170 + lVar195 + lVar201]))) {
                              lVar222 = (long)(((iVar208 + iVar15) - local_938) + 1);
                              if ((pdVar92[lVar170 + lVar222 + lVar201] == 1.0) &&
                                 (!NAN(pdVar92[lVar170 + lVar222 + lVar201]))) {
                                lVar190 = LVar93 * (iVar148 - local_934);
                                if ((pdVar92[lVar190 + lVar195 + lVar201] == 1.0) &&
                                   (((!NAN(pdVar92[lVar190 + lVar195 + lVar201]) &&
                                     (pdVar92[lVar190 + lVar222 + lVar201] == 1.0)) &&
                                    (!NAN(pdVar92[lVar190 + lVar222 + lVar201]))))) {
                                  lVar201 = LVar94 * ((iVar13 + 2) - iVar96);
                                  if ((((pdVar92[lVar170 + lVar195 + lVar201] == 1.0) &&
                                       (!NAN(pdVar92[lVar170 + lVar195 + lVar201]))) &&
                                      ((pdVar92[lVar170 + lVar222 + lVar201] == 1.0 &&
                                       ((!NAN(pdVar92[lVar170 + lVar222 + lVar201]) &&
                                        (pdVar92[lVar190 + lVar195 + lVar201] == 1.0)))))) &&
                                     (!NAN(pdVar92[lVar190 + lVar195 + lVar201]))) {
                                    uVar175 = -(uint)(pdVar92[lVar190 + lVar222 + lVar201] == 1.0) &
                                              1;
                                  }
                                }
                                goto LAB_004d0482;
                              }
                            }
                            goto LAB_004d047d;
                          }
                        }
                        goto LAB_004d0482;
                      }
                    }
                    goto LAB_004d047d;
                  }
                }
              }
LAB_004d0482:
              bVar140 = Box::contains(&bx_4,i_00,j_00,k);
              lVar170 = (long)i_00;
              local_d78 = (int)local_1088;
              local_d74 = SUB84(local_1088,4);
              local_cb8 = (int)local_5b8;
              local_cb4 = SUB84(local_5b8,4);
              if (bVar140) {
                lVar222 = (long)((iVar208 + iVar15) - local_9b8);
                lVar190 = (iVar14 - local_9b4) * LVar103;
                lVar202 = (iVar148 - local_9b4) * LVar103;
                lVar201 = (iVar13 - iVar106) * LVar104;
                lVar184 = (iVar147 - iVar106) * LVar104;
                dVar230 = (pdVar102[lVar190 + lVar222 + lVar201] +
                           pdVar102[lVar202 + lVar222 + lVar201] +
                           pdVar102[lVar190 + lVar222 + lVar184] +
                          pdVar102[lVar202 + lVar222 + lVar184]) * 0.25;
                *(double *)
                 ((lVar204 - local_d74) * lVar180 * 8 + (lVar177 - iStack_1080) * lVar181 * 8 +
                  (long)local_d78 * -8 + uVar18 + lVar214 + lVar224 * 4) = dVar230;
                if ((dVar230 != 0.0) || (NAN(dVar230))) {
                  local_8f8 = (int)uVar90;
                  lVar196 = (long)((iVar208 + iVar15) - local_8f8);
                  local_8f4 = SUB84(uVar90,4);
                  lVar209 = (iVar14 - local_8f4) * LVar87;
                  lVar223 = (iVar148 - local_8f4) * LVar87;
                  lVar205 = (iVar13 - iVar91) * LVar88;
                  lVar191 = (iVar147 - iVar91) * LVar88;
                  dVar230 = (1.0 / dVar230) * 0.25;
                  lVar195 = (lVar204 - local_cb4) * lVar199 * 8 +
                            (lVar177 - iStack_5b0) * lVar227 * 8 + (long)local_cb8 * -8 + uVar40 +
                            lVar214;
                  *(double *)(lVar195 + lVar224 * 4) =
                       ((pdVar86[lVar223 + lVar196 + lVar191] * 0.5 + 0.25) *
                        pdVar102[lVar202 + lVar222 + lVar184] +
                       (pdVar86[lVar209 + lVar196 + lVar191] * 0.5 + -0.25) *
                       pdVar102[lVar190 + lVar222 + lVar184] +
                       (pdVar86[lVar209 + lVar196 + lVar205] * 0.5 + -0.25) *
                       pdVar102[lVar190 + lVar222 + lVar201] +
                       (pdVar86[lVar223 + lVar196 + lVar205] * 0.5 + 0.25) *
                       pdVar102[lVar202 + lVar222 + lVar201]) * dVar230;
                  lVar195 = lVar195 + local_1318;
                  dVar230 = (((pdVar86 + lVar223 + lVar196 + lVar191)[LVar89] * 0.5 + 0.25) *
                             pdVar102[lVar202 + lVar222 + lVar184] +
                            ((pdVar86 + lVar209 + lVar196 + lVar191)[LVar89] * 0.5 + 0.25) *
                            pdVar102[lVar190 + lVar222 + lVar184] +
                            ((pdVar86 + lVar209 + lVar196 + lVar205)[LVar89] * 0.5 + -0.25) *
                            pdVar102[lVar190 + lVar222 + lVar201] +
                            ((pdVar86 + lVar223 + lVar196 + lVar205)[LVar89] * 0.5 + -0.25) *
                            pdVar102[lVar202 + lVar222 + lVar201]) * dVar230;
                }
                else {
                  lVar195 = uVar40 + (lVar155 - local_cb4) * lVar199 * 8 + (lVar170 - local_cb8) * 8
                            + (lVar154 - iStack_5b0) * lVar227 * 8;
                  *(undefined8 *)
                   (uVar40 + lVar214 +
                    (lVar204 - local_cb4) * lVar199 * 8 + (lVar177 - iStack_5b0) * lVar227 * 8 +
                    (long)local_cb8 * -8 + lVar224 * 4) = 0;
                  dVar230 = 0.0;
                }
LAB_004d0953:
                *(double *)(lVar195 + lVar151 * 8) = dVar230;
              }
              else {
                bVar140 = Box::contains(&bx_7,i_00,j_00,k);
                if (bVar140) {
                  *(undefined8 *)
                   ((lVar204 - local_d74) * lVar180 * 8 + (lVar177 - iStack_1080) * lVar181 * 8 +
                    (long)local_d78 * -8 + uVar18 + lVar214 + lVar224 * 4) = 0x3ff0000000000000;
                  lVar195 = uVar40 + (lVar155 - local_cb4) * lVar199 * 8 + (lVar170 - local_cb8) * 8
                            + (lVar154 - iStack_5b0) * lVar227 * 8;
                  *(undefined8 *)
                   (uVar40 + lVar214 +
                    (lVar204 - local_cb4) * lVar199 * 8 + (lVar177 - iStack_5b0) * lVar227 * 8 +
                    (long)local_cb8 * -8 + lVar224 * 4) = 0;
                  dVar230 = 0.0;
                  goto LAB_004d0953;
                }
              }
              bVar140 = Box::contains(&bx_5,i_00,j_00,k);
              lVar195 = (long)iVar14;
              local_d38 = (int)local_f48;
              local_d34 = SUB84(local_f48,4);
              local_c78 = (int)local_5f8;
              local_c74 = SUB84(local_5f8,4);
              if (bVar140) {
                local_978 = (iVar208 + iVar15) - local_978;
                lVar190 = (long)local_978;
                lVar202 = (lVar155 * 2 - (long)local_974) * LVar98;
                lVar222 = (iVar13 - iVar101) * LVar99;
                lVar184 = (long)(local_978 + 1);
                lVar191 = (iVar147 - iVar101) * LVar99;
                dVar230 = (pdVar97[lVar202 + lVar190 + lVar222] +
                           pdVar97[lVar202 + lVar184 + lVar222] +
                           pdVar97[lVar202 + lVar190 + lVar191] +
                          pdVar97[lVar202 + lVar184 + lVar191]) * 0.25;
                *(double *)
                 ((lVar204 - local_d34) * lVar150 * 8 + (lVar177 - iStack_f40) * lVar193 * 8 +
                  (long)local_d38 * -8 + uVar19 + lVar214 + lVar224 * 4) = dVar230;
                if ((dVar230 != 0.0) || (NAN(dVar230))) {
                  local_8b8 = (int)uVar84;
                  local_8b8 = (iVar208 + iVar15) - local_8b8;
                  local_8b4 = SUB84(uVar84,4);
                  lVar209 = (lVar195 - local_8b4) * LVar81;
                  lVar196 = (iVar13 - iVar85) * LVar82;
                  lVar205 = (iVar147 - iVar85) * LVar82;
                  dVar230 = (1.0 / dVar230) * 0.25;
                  lVar201 = (lVar204 - local_c74) * lVar169 * 8 +
                            (lVar177 - iStack_5f0) * lVar183 * 8 + (long)local_c78 * -8 + uVar39 +
                            lVar214;
                  *(double *)(lVar201 + lVar224 * 4) =
                       ((pdVar80[lVar209 + (local_8b8 + 1) + lVar205] * 0.5 + 0.25) *
                        pdVar97[lVar202 + lVar184 + lVar191] +
                       (pdVar80[lVar209 + local_8b8 + lVar205] * 0.5 + -0.25) *
                       pdVar97[lVar202 + lVar190 + lVar191] +
                       (pdVar80[lVar209 + local_8b8 + lVar196] * 0.5 + -0.25) *
                       pdVar97[lVar202 + lVar190 + lVar222] +
                       (pdVar80[lVar209 + (local_8b8 + 1) + lVar196] * 0.5 + 0.25) *
                       pdVar97[lVar202 + lVar184 + lVar222]) * dVar230;
                  lVar201 = lVar201 + local_1318;
                  dVar230 = (((pdVar80 + lVar209 + (local_8b8 + 1) + lVar205)[LVar83] * 0.5 + 0.25)
                             * pdVar97[lVar202 + lVar184 + lVar191] +
                            ((pdVar80 + lVar209 + local_8b8 + lVar205)[LVar83] * 0.5 + 0.25) *
                            pdVar97[lVar202 + lVar190 + lVar191] +
                            ((pdVar80 + lVar209 + local_8b8 + lVar196)[LVar83] * 0.5 + -0.25) *
                            pdVar97[lVar202 + lVar190 + lVar222] +
                            ((pdVar80 + lVar209 + (local_8b8 + 1) + lVar196)[LVar83] * 0.5 + -0.25)
                            * pdVar97[lVar202 + lVar184 + lVar222]) * dVar230;
                }
                else {
                  lVar201 = uVar39 + (lVar155 - local_c74) * lVar169 * 8 + (lVar170 - local_c78) * 8
                            + (lVar154 - iStack_5f0) * lVar183 * 8;
                  *(undefined8 *)
                   (uVar39 + lVar214 +
                    (lVar204 - local_c74) * lVar169 * 8 + (lVar177 - iStack_5f0) * lVar183 * 8 +
                    (long)local_c78 * -8 + lVar224 * 4) = 0;
                  dVar230 = 0.0;
                }
LAB_004d0e02:
                *(double *)(lVar201 + lVar189 * 8) = dVar230;
              }
              else {
                bVar140 = Box::contains(&bx_8,i_00,j_00,k);
                if (bVar140) {
                  *(undefined8 *)
                   ((lVar204 - local_d34) * lVar150 * 8 + (lVar177 - iStack_f40) * lVar193 * 8 +
                    (long)local_d38 * -8 + uVar19 + lVar214 + lVar224 * 4) = 0x3ff0000000000000;
                  lVar201 = uVar39 + (lVar155 - local_c74) * lVar169 * 8 + (lVar170 - local_c78) * 8
                            + (lVar154 - iStack_5f0) * lVar183 * 8;
                  *(undefined8 *)
                   (uVar39 + lVar214 +
                    (lVar204 - local_c74) * lVar169 * 8 + (lVar177 - iStack_5f0) * lVar183 * 8 +
                    (long)local_c78 * -8 + lVar224 * 4) = 0;
                  dVar230 = 0.0;
                  goto LAB_004d0e02;
                }
              }
              bVar140 = Box::contains(&bx_6,i_00,j_00,k);
              lVar201 = (long)iVar13;
              local_cf8 = (int)local_578;
              local_cf4 = SUB84(local_578,4);
              local_c38 = (int)uVar46;
              local_c34 = SUB84(uVar46,4);
              if (bVar140) {
                local_938 = (iVar208 + iVar15) - local_938;
                lVar184 = (long)local_938;
                lVar190 = (iVar14 - local_934) * LVar93;
                lVar222 = (lVar154 * 2 - (long)iVar96) * LVar94;
                lVar191 = (long)(local_938 + 1);
                lVar202 = (iVar148 - local_934) * LVar93;
                dVar230 = (pdVar92[lVar190 + lVar184 + lVar222] +
                           pdVar92[lVar190 + lVar191 + lVar222] +
                           pdVar92[lVar202 + lVar184 + lVar222] +
                          pdVar92[lVar202 + lVar191 + lVar222]) * 0.25;
                *(double *)
                 ((lVar204 - local_cf4) * lVar163 * 8 + (lVar177 - iStack_570) * lVar200 * 8 +
                  (long)local_cf8 * -8 + uVar41 + lVar214 + lVar224 * 4) = dVar230;
                if ((dVar230 != 0.0) || (NAN(dVar230))) {
                  local_878 = (int)uVar78;
                  local_878 = (iVar208 + iVar15) - local_878;
                  local_874 = SUB84(uVar78,4);
                  lVar209 = (iVar14 - local_874) * LVar75;
                  lVar196 = (lVar201 - iVar79) * LVar76;
                  lVar205 = (iVar148 - local_874) * LVar75;
                  dVar230 = (1.0 / dVar230) * 0.25;
                  lVar170 = lVar214 + (lVar204 - local_c34) * LVar43 * 8 +
                                      (lVar177 - iVar47) * LVar44 * 8 + (long)local_c38 * -8;
                  *(double *)((long)pdVar42 + lVar224 * 4 + lVar170) =
                       ((pdVar74[lVar205 + (local_878 + 1) + lVar196] * 0.5 + 0.25) *
                        pdVar92[lVar202 + lVar191 + lVar222] +
                       (pdVar74[lVar205 + local_878 + lVar196] * 0.5 + -0.25) *
                       pdVar92[lVar202 + lVar184 + lVar222] +
                       (pdVar74[lVar209 + local_878 + lVar196] * 0.5 + -0.25) *
                       pdVar92[lVar190 + lVar184 + lVar222] +
                       (pdVar74[lVar209 + (local_878 + 1) + lVar196] * 0.5 + 0.25) *
                       pdVar92[lVar190 + lVar191 + lVar222]) * dVar230;
                  lVar170 = local_1318 + lVar170;
                  dVar230 = (((pdVar74 + lVar205 + (local_878 + 1) + lVar196)[LVar77] * 0.5 + 0.25)
                             * pdVar92[lVar202 + lVar191 + lVar222] +
                            ((pdVar74 + lVar205 + local_878 + lVar196)[LVar77] * 0.5 + 0.25) *
                            pdVar92[lVar202 + lVar184 + lVar222] +
                            ((pdVar74 + lVar209 + local_878 + lVar196)[LVar77] * 0.5 + -0.25) *
                            pdVar92[lVar190 + lVar184 + lVar222] +
                            ((pdVar74 + lVar209 + (local_878 + 1) + lVar196)[LVar77] * 0.5 + -0.25)
                            * pdVar92[lVar190 + lVar191 + lVar222]) * dVar230;
                }
                else {
                  lVar170 = (lVar154 - iVar47) * LVar44 * 8 +
                            (lVar170 - local_c38) * 8 + (lVar155 - local_c34) * LVar43 * 8;
                  lVar222 = (lVar204 - local_c34) * LVar43 * 8 + (lVar177 - iVar47) * LVar44 * 8 +
                            (long)local_c38 * -8;
LAB_004d12b0:
                  *(undefined8 *)((long)(int *)pdVar42 + lVar224 * 4 + lVar222 + lVar214) = 0;
                  dVar230 = 0.0;
                }
                *(double *)((long)(int *)pdVar42 + LVar45 * 8 + lVar170) = dVar230;
              }
              else {
                bVar140 = Box::contains(&bx_9,i_00,j_00,k);
                if (bVar140) {
                  *(undefined8 *)
                   ((lVar204 - local_cf4) * lVar163 * 8 + (lVar177 - iStack_570) * lVar200 * 8 +
                    (long)local_cf8 * -8 + uVar41 + lVar214 + lVar224 * 4) = 0x3ff0000000000000;
                  lVar170 = (lVar154 - iVar47) * LVar44 * 8 +
                            (lVar170 - local_c38) * 8 + (lVar155 - local_c34) * LVar43 * 8;
                  lVar222 = (lVar204 - local_c34) * LVar43 * 8 + (lVar177 - iVar47) * LVar44 * 8 +
                            (long)local_c38 * -8;
                  goto LAB_004d12b0;
                }
              }
              bVar140 = Box::contains(&bx_10,i_00,j_00,k);
              if (bVar140) {
                local_838 = (int)uVar72;
                local_838 = (iVar15 + iVar208) - local_838;
                local_834 = SUB84(uVar72,4);
                lVar170 = (lVar195 - local_834) * LVar70;
                lVar222 = (lVar201 - iVar73) * LVar71;
                dVar233 = pdVar69[lVar170 + local_838 + lVar222];
                dVar6 = pdVar69[lVar170 + (local_838 + 1) + lVar222];
                if ((dVar233 == 1.0) && (!NAN(dVar233))) {
                  dVar230 = 1.0;
                  if ((dVar6 == 1.0) && (!NAN(dVar6))) goto LAB_004d1462;
                }
                if ((dVar233 == -1.0) && (!NAN(dVar233))) {
                  dVar230 = -1.0;
                  if ((dVar6 == -1.0) && (!NAN(dVar6))) goto LAB_004d1462;
                }
                dVar230 = (double)(~-(ulong)(dVar233 == -1.0) &
                                  (-(ulong)(dVar233 == 1.0) & 0xbfd0000000000000 |
                                  ~-(ulong)(dVar233 == 1.0) & (ulong)(dVar233 * 0.5 + -0.25)));
                dVar233 = (double)(~-(ulong)(dVar6 == -1.0) &
                                  (-(ulong)(dVar6 == 1.0) & 0x3fd0000000000000 |
                                  ~-(ulong)(dVar6 == 1.0) & (ulong)(dVar6 * 0.5 + 0.25)));
                dVar230 = (dVar233 * dVar233 - dVar230 * dVar230) / ((dVar233 - dVar230) + 1e-30);
                if (dVar230 <= -0.5) {
                  dVar230 = -0.5;
                }
                if (0.5 <= dVar230) {
                  dVar230 = 0.5;
                }
LAB_004d1462:
                local_bf8 = (int)local_678;
                local_bf4 = SUB84(local_678,4);
                *(double *)
                 ((long)ppVar30 +
                 lVar224 * 4 +
                 lVar214 + (lVar204 - local_bf4) * (long)ppVar221 * 8 +
                           (lVar177 - iStack_670) * (long)ppVar31 * 8 + (long)local_bf8 * -8) =
                     dVar230;
              }
              else {
                bVar140 = Box::contains(&bx_13,i_00,j_00,k);
                dVar230 = 1.0;
                if (bVar140) goto LAB_004d1462;
              }
              bVar140 = Box::contains(&bx_11,i_00,j_00,k);
              if (bVar140) {
                local_7f8 = (int)uVar67;
                lVar170 = (long)((iVar208 + iVar15) - local_7f8);
                local_7f4 = SUB84(uVar67,4);
                lVar201 = (lVar201 - iVar68) * LVar66;
                dVar233 = pdVar64[(iVar14 - local_7f4) * LVar65 + lVar170 + lVar201];
                dVar6 = pdVar64[(iVar148 - local_7f4) * LVar65 + lVar170 + lVar201];
                if ((dVar233 == 1.0) && (!NAN(dVar233))) {
                  dVar230 = 1.0;
                  if ((dVar6 == 1.0) && (!NAN(dVar6))) goto LAB_004d1672;
                }
                if ((dVar233 == -1.0) && (!NAN(dVar233))) {
                  dVar230 = -1.0;
                  if ((dVar6 == -1.0) && (!NAN(dVar6))) goto LAB_004d1672;
                }
                dVar230 = (double)(~-(ulong)(dVar233 == -1.0) &
                                  (-(ulong)(dVar233 == 1.0) & 0xbfd0000000000000 |
                                  ~-(ulong)(dVar233 == 1.0) & (ulong)(dVar233 * 0.5 + -0.25)));
                dVar233 = (double)(~-(ulong)(dVar6 == -1.0) &
                                  (-(ulong)(dVar6 == 1.0) & 0x3fd0000000000000 |
                                  ~-(ulong)(dVar6 == 1.0) & (ulong)(dVar6 * 0.5 + 0.25)));
                dVar230 = (dVar233 * dVar233 - dVar230 * dVar230) / ((dVar233 - dVar230) + 1e-30);
                if (dVar230 <= -0.5) {
                  dVar230 = -0.5;
                }
                if (0.5 <= dVar230) {
                  dVar230 = 0.5;
                }
LAB_004d1672:
                local_bb8 = (int)uVar53;
                local_bb4 = SUB84(uVar53,4);
                *(double *)
                 ((long)pdVar51 +
                 lVar224 * 4 +
                 lVar214 + (lVar204 - local_bb4) * lVar194 * 8 + (lVar177 - iVar54) * LVar52 * 8 +
                           (long)local_bb8 * -8) = dVar230;
              }
              else {
                bVar140 = Box::contains(&bx_14,i_00,j_00,k);
                dVar230 = 1.0;
                if (bVar140) goto LAB_004d1672;
              }
              bVar140 = Box::contains(&bx_12,i_00,j_00,k);
              if (bVar140) {
                local_7b8 = (int)uVar62;
                lVar170 = (long)((iVar208 + iVar15) - local_7b8);
                local_7b4 = SUB84(uVar62,4);
                lVar195 = (lVar195 - local_7b4) * LVar60;
                dVar233 = pdVar59[lVar195 + lVar170 + (iVar13 - iVar63) * LVar61];
                dVar6 = pdVar59[lVar195 + lVar170 + (iVar147 - iVar63) * LVar61];
                if ((dVar233 == 1.0) && (!NAN(dVar233))) {
                  dVar230 = 1.0;
                  if ((dVar6 == 1.0) && (!NAN(dVar6))) goto LAB_004d186d;
                }
                if ((dVar233 == -1.0) && (!NAN(dVar233))) {
                  dVar230 = -1.0;
                  if ((dVar6 == -1.0) && (!NAN(dVar6))) goto LAB_004d186d;
                }
                dVar230 = (double)(~-(ulong)(dVar233 == -1.0) &
                                  (-(ulong)(dVar233 == 1.0) & 0xbfd0000000000000 |
                                  ~-(ulong)(dVar233 == 1.0) & (ulong)(dVar233 * 0.5 + -0.25)));
                dVar233 = (double)(~-(ulong)(dVar6 == -1.0) &
                                  (-(ulong)(dVar6 == 1.0) & 0x3fd0000000000000 |
                                  ~-(ulong)(dVar6 == 1.0) & (ulong)(dVar6 * 0.5 + 0.25)));
                dVar230 = (dVar233 * dVar233 - dVar230 * dVar230) / ((dVar233 - dVar230) + 1e-30);
                if (dVar230 <= -0.5) {
                  dVar230 = -0.5;
                }
                if (0.5 <= dVar230) {
                  dVar230 = 0.5;
                }
LAB_004d186d:
                local_b78 = (int)local_4f0;
                local_b74 = SUB84(local_4f0,4);
                *(double *)
                 ((lVar204 - local_b74) * lVar2 * 8 + (lVar177 - iStack_4e8) * local_500 * 8 +
                  (long)local_b78 * -8 + lVar213 + lVar214 + lVar224 * 4) = dVar230;
              }
              else {
                bVar140 = Box::contains(&bx_15,i_00,j_00,k);
                dVar230 = 1.0;
                if (bVar140) goto LAB_004d186d;
              }
              if ((int)uVar175 <
                  (int)*(uint *)mfi.m_fa._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl) {
                uVar175 = *(uint *)mfi.m_fa._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                ;
              }
              *(uint *)mfi.m_fa._M_t.
                       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                       .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = uVar175;
              lVar224 = lVar224 + 2;
              local_1318 = local_1318 + 8;
            }
          }
        }
        if (iVar162 <= tile_error) {
          iVar162 = tile_error;
        }
        MFIter::operator++(&mfi_2);
      }
      MFIter::~MFIter(&mfi_2);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = iVar162 != 0;
      ParallelDescriptor::ReduceBoolOr((bool *)&mfi);
      if ((byte)mfi.m_fa._M_t.
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl == '\0') {
        buildCellFlag(this);
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int
Level::coarsenFromFine (Level& fineLevel, bool fill_boundary)
{
    const BoxArray& fine_grids = fineLevel.m_grids;
    const BoxArray& fine_covered_grids = fineLevel.m_covered_grids;
    const DistributionMapping& fine_dmap = fineLevel.m_dmap;
    m_grids = amrex::coarsen(fine_grids,2);
    m_covered_grids = amrex::coarsen(fine_covered_grids, 2);
    m_dmap = fine_dmap;

    if (! (fine_grids.coarsenable(2,2) &&
           (fine_covered_grids.empty() || fine_covered_grids.coarsenable(2,2)))) {
        return 1;
    }

    auto const& f_levelset = fineLevel.m_levelset;
    m_levelset.define(amrex::convert(m_grids,IntVect::TheNodeVector()), m_dmap, 1, 0);
    int mvmc_error = 0;

    if (Gpu::notInLaunchRegion())
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mvmc_error)
#endif
        for (MFIter mfi(m_levelset,true); mfi.isValid(); ++mfi)
        {
            const Box& ccbx = mfi.tilebox(IntVect::TheCellVector());
            const Box& ndbx = mfi.tilebox();
            auto const& crse = m_levelset.array(mfi);
            auto const& fine = f_levelset.const_array(mfi);

            amrex::LoopConcurrentOnCpu(ndbx,
            [=] (int i, int j, int k) noexcept
            {
                crse(i,j,k) = fine(2*i,2*j,2*k);
            });

            int tile_error = 0;
            amrex::LoopOnCpu(ccbx,
            [=,&tile_error] (int i, int j, int k) noexcept
            {
                int ierror = check_mvmc(i,j,k,fine);
                tile_error = std::max(tile_error,ierror);
            });

            mvmc_error = std::max(mvmc_error, tile_error);
        }
    }
    else
    {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(m_levelset); mfi.isValid(); ++mfi)
        {
            const Box& ndbx = mfi.validbox();
            const Box& ccbx = amrex::enclosedCells(ndbx);
            auto const& crse = m_levelset.array(mfi);
            auto const& fine = f_levelset.const_array(mfi);
            reduce_op.eval(ndbx, reduce_data,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
            {
                crse(i,j,k) = fine(2*i,2*j,2*k);
                int ierror;
                if (ccbx.contains(IntVect{AMREX_D_DECL(i,j,k)})) {
                    ierror = check_mvmc(i,j,k,fine);
                } else {
                    ierror = 0;
                }
                return {ierror};
            });
        }
        ReduceTuple rv = reduce_data.value(reduce_op);
        mvmc_error = amrex::max(0, amrex::get<0>(rv));
    }

    {
        bool b = mvmc_error;
        ParallelDescriptor::ReduceBoolOr(b);
        mvmc_error = b;
    }
    if (mvmc_error) return mvmc_error;

    const int ng = 2;
    m_cellflag.define(m_grids, m_dmap, 1, ng);
    m_volfrac.define(m_grids, m_dmap, 1, ng);
    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    m_bndryarea.define(m_grids, m_dmap, 1, ng);
    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng);
    }

    auto& f_cellflag = fineLevel.m_cellflag;
    MultiFab& f_volfrac = fineLevel.m_volfrac;
    MultiFab& f_centroid = fineLevel.m_centroid;
    MultiFab& f_bndryarea = fineLevel.m_bndryarea;
    MultiFab& f_bndrycent = fineLevel.m_bndrycent;
    MultiFab& f_bndrynorm = fineLevel.m_bndrynorm;
    auto& f_areafrac = fineLevel.m_areafrac;
    auto& f_facecent = fineLevel.m_facecent;
    auto& f_edgecent = fineLevel.m_edgecent;

    if (fill_boundary)
    {
        const Geometry& fine_geom = fineLevel.m_geom;
        const auto& fine_period = fine_geom.periodicity();
        f_cellflag.FillBoundary(fine_period);
        f_volfrac.FillBoundary(fine_period);
        f_centroid.FillBoundary(fine_period);
        f_bndryarea.FillBoundary(fine_period);
        f_bndrycent.FillBoundary(fine_period);
        f_bndrynorm.FillBoundary(fine_period);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            f_areafrac[idim].FillBoundary(fine_period);
            f_facecent[idim].FillBoundary(fine_period);
            f_edgecent[idim].FillBoundary(fine_period);
        }

        if (!fine_covered_grids.empty())
        {
            const std::vector<IntVect>& pshifts = fine_period.shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            {
                std::vector<std::pair<int,Box> > isects;
                for (MFIter mfi(f_volfrac); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.fabbox();
                    auto const& vfrac = f_volfrac.array(mfi);
                    auto const& cflag = f_cellflag.array(mfi);
                    AMREX_D_TERM(auto const& apx = f_areafrac[0].array(mfi);,
                                 auto const& apy = f_areafrac[1].array(mfi);,
                                 auto const& apz = f_areafrac[2].array(mfi););

                    for (const auto& iv : pshifts)
                    {
                        fine_covered_grids.intersections(bx+iv, isects);
                        for (const auto& is : isects)
                        {
                            Box const& ibox = is.second - iv;
                            Box const& indbox = amrex::surroundingNodes(ibox);
                            AMREX_D_TERM(auto const& xbx = amrex::surroundingNodes(ibox,0);,
                                         auto const& ybx = amrex::surroundingNodes(ibox,1);,
                                         auto const& zbx = amrex::surroundingNodes(ibox,2););
                            AMREX_HOST_DEVICE_FOR_3D(indbox, i,j,k,
                            {
                                IntVect cell(AMREX_D_DECL(i,j,k));
                                if (ibox.contains(cell)) {
                                    vfrac(i,j,k) = 0.0;
                                    cflag(i,j,k) = EBCellFlag::TheCoveredCell();
                                }
                                AMREX_D_TERM(if (xbx.contains(cell)) apx(i,j,k) = 0.0;,
                                             if (ybx.contains(cell)) apy(i,j,k) = 0.0;,
                                             if (zbx.contains(cell)) apz(i,j,k) = 0.0;);
                            });
                        }
                    }
                }
            }
        }
    }

    int error = 0;

    if (Gpu::notInLaunchRegion())
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:error)
#endif
        for (MFIter mfi(m_volfrac,true); mfi.isValid(); ++mfi)
        {
            auto const& cvol = m_volfrac.array(mfi);
            auto const& ccent = m_centroid.array(mfi);
            auto const& cba = m_bndryarea.array(mfi);
            auto const& cbc = m_bndrycent.array(mfi);
            auto const& cbn = m_bndrynorm.array(mfi);
            AMREX_D_TERM(auto const& capx = m_areafrac[0].array(mfi);,
                         auto const& capy = m_areafrac[1].array(mfi);,
                         auto const& capz = m_areafrac[2].array(mfi););
            AMREX_D_TERM(auto const& cfcx = m_facecent[0].array(mfi);,
                         auto const& cfcy = m_facecent[1].array(mfi);,
                         auto const& cfcz = m_facecent[2].array(mfi););
            AMREX_D_TERM(auto const& cecx = m_edgecent[0].array(mfi);,
                         auto const& cecy = m_edgecent[1].array(mfi);,
                         auto const& cecz = m_edgecent[2].array(mfi););
            auto const& cflag = m_cellflag.array(mfi);

            auto const& fvol = f_volfrac.const_array(mfi);
            auto const& fcent = f_centroid.const_array(mfi);
            auto const& fba = f_bndryarea.const_array(mfi);
            auto const& fbc = f_bndrycent.const_array(mfi);
            auto const& fbn = f_bndrynorm.const_array(mfi);
            AMREX_D_TERM(auto const& fapx = f_areafrac[0].const_array(mfi);,
                         auto const& fapy = f_areafrac[1].const_array(mfi);,
                         auto const& fapz = f_areafrac[2].const_array(mfi););
            AMREX_D_TERM(auto const& ffcx = f_facecent[0].const_array(mfi);,
                         auto const& ffcy = f_facecent[1].const_array(mfi);,
                         auto const& ffcz = f_facecent[2].const_array(mfi););
            AMREX_D_TERM(auto const& fecx = f_edgecent[0].const_array(mfi);,
                         auto const& fecy = f_edgecent[1].const_array(mfi);,
                         auto const& fecz = f_edgecent[2].const_array(mfi););
            auto const& fflag = f_cellflag.const_array(mfi);

            Box const& bx = mfi.validbox();
            Box const& ndgbx = mfi.grownnodaltilebox(-1,2);

            int tile_error = 0;
            amrex::LoopOnCpu(ndgbx,
            [=,&tile_error] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                int ierr = coarsen_from_fine(AMREX_D_DECL(i,j,k), bx, 2,
                                             cvol,ccent,cba,cbc,cbn,
                                             AMREX_D_DECL(capx,capy,capz),
                                             AMREX_D_DECL(cfcx,cfcy,cfcz),
                                             AMREX_D_DECL(cecx,cecy,cecz),
                                             cflag,fvol,fcent,fba,fbc,fbn,
                                             AMREX_D_DECL(fapx,fapy,fapz),
                                             AMREX_D_DECL(ffcx,ffcy,ffcz),
                                             AMREX_D_DECL(fecx,fecy,fecz),
                                             fflag);
                tile_error = std::max(tile_error,ierr);
            });

            error = std::max(error,tile_error);
        }
    }
    else
    {
        ReduceOps<ReduceOpMax> reduce_op;
        ReduceData<int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;

        for (MFIter mfi(m_volfrac); mfi.isValid(); ++mfi)
        {
            auto const& cvol = m_volfrac.array(mfi);
            auto const& ccent = m_centroid.array(mfi);
            auto const& cba = m_bndryarea.array(mfi);
            auto const& cbc = m_bndrycent.array(mfi);
            auto const& cbn = m_bndrynorm.array(mfi);
            AMREX_D_TERM(auto const& capx = m_areafrac[0].array(mfi);,
                         auto const& capy = m_areafrac[1].array(mfi);,
                         auto const& capz = m_areafrac[2].array(mfi););
            AMREX_D_TERM(auto const& cfcx = m_facecent[0].array(mfi);,
                         auto const& cfcy = m_facecent[1].array(mfi);,
                         auto const& cfcz = m_facecent[2].array(mfi););
            AMREX_D_TERM(auto const& cecx = m_edgecent[0].array(mfi);,
                         auto const& cecy = m_edgecent[1].array(mfi);,
                         auto const& cecz = m_edgecent[2].array(mfi););
            auto const& cflag = m_cellflag.array(mfi);

            auto const& fvol = f_volfrac.const_array(mfi);
            auto const& fcent = f_centroid.const_array(mfi);
            auto const& fba = f_bndryarea.const_array(mfi);
            auto const& fbc = f_bndrycent.const_array(mfi);
            auto const& fbn = f_bndrynorm.const_array(mfi);
            AMREX_D_TERM(auto const& fapx = f_areafrac[0].const_array(mfi);,
                         auto const& fapy = f_areafrac[1].const_array(mfi);,
                         auto const& fapz = f_areafrac[2].const_array(mfi););
            AMREX_D_TERM(auto const& ffcx = f_facecent[0].const_array(mfi);,
                         auto const& ffcy = f_facecent[1].const_array(mfi);,
                         auto const& ffcz = f_facecent[2].const_array(mfi););
            AMREX_D_TERM(auto const& fecx = f_edgecent[0].const_array(mfi);,
                         auto const& fecy = f_edgecent[1].const_array(mfi);,
                         auto const& fecz = f_edgecent[2].const_array(mfi););
            auto const& fflag = f_cellflag.const_array(mfi);

            Box const& bx = mfi.validbox();
            Box const& gbx = amrex::grow(bx,2);
            Box const& ndgbx = amrex::surroundingNodes(gbx);

            reduce_op.eval(ndgbx, reduce_data,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
            {
                amrex::ignore_unused(j,k);
                int ierr = coarsen_from_fine(AMREX_D_DECL(i,j,k), bx, 2,
                                             cvol,ccent,cba,cbc,cbn,
                                             AMREX_D_DECL(capx,capy,capz),
                                             AMREX_D_DECL(cfcx,cfcy,cfcz),
                                             AMREX_D_DECL(cecx,cecy,cecz),
                                             cflag,fvol,fcent,fba,fbc,fbn,
                                             AMREX_D_DECL(fapx,fapy,fapz),
                                             AMREX_D_DECL(ffcx,ffcy,ffcz),
                                             AMREX_D_DECL(fecx,fecy,fecz),
                                             fflag);
                return {ierr};
            });
        }

        ReduceTuple rv = reduce_data.value(reduce_op);
        error = amrex::max(0, amrex::get<0>(rv));
    }

    {
        bool b = error;
        ParallelDescriptor::ReduceBoolOr(b);
        error = b;
    }

    if (!error) {
        buildCellFlag();
    }

    return error;
}